

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [12];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  byte unaff_BL;
  long lVar79;
  uint uVar80;
  undefined4 uVar81;
  ulong uVar82;
  ulong uVar83;
  float fVar84;
  undefined8 uVar87;
  vint4 bi_2;
  float fVar85;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar86;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 extraout_var [60];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  float fVar119;
  float fVar152;
  float fVar153;
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar142 [32];
  float fVar154;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar132 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar141 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar161 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 ai_2;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar211;
  float fVar212;
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [28];
  float fVar214;
  float fVar215;
  undefined1 auVar207 [32];
  float fVar213;
  float fVar216;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar205 [16];
  undefined1 auVar210 [32];
  vint4 bi;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar240;
  float fVar246;
  float fVar247;
  undefined1 auVar241 [16];
  undefined1 auVar242 [28];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar252;
  float fVar260;
  vint4 ai_1;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar261;
  float fVar262;
  undefined1 auVar259 [64];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 auVar264 [16];
  undefined1 auVar266 [64];
  float fVar272;
  float fVar273;
  undefined1 auVar267 [16];
  float fVar274;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar279;
  float fVar280;
  undefined1 auVar278 [64];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_be9;
  undefined8 local_b60;
  undefined8 uStack_b58;
  ulong local_b50;
  float local_b48;
  float local_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 *local_9f8;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [48];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  Primitive *local_810;
  ulong local_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  uint local_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  RTCHitN local_680 [16];
  undefined1 auStack_670 [16];
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  uint local_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  uint uStack_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  ulong local_5e0;
  undefined1 auStack_5d8 [24];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar268 [16];
  
  PVar1 = prim[1];
  uVar83 = (ulong)(byte)PVar1;
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar202 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar202 = vinsertps_avx(auVar202,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar84 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar88._0_4_ = fVar84 * auVar96._0_4_;
  auVar88._4_4_ = fVar84 * auVar96._4_4_;
  auVar88._8_4_ = fVar84 * auVar96._8_4_;
  auVar88._12_4_ = fVar84 * auVar96._12_4_;
  auVar217._0_4_ = fVar84 * auVar202._0_4_;
  auVar217._4_4_ = fVar84 * auVar202._4_4_;
  auVar217._8_4_ = fVar84 * auVar202._8_4_;
  auVar217._12_4_ = fVar84 * auVar202._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar256 = vcvtdq2ps_avx(auVar256);
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar83 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  uVar78 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + uVar83 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar78 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar284._4_4_ = auVar217._0_4_;
  auVar284._0_4_ = auVar217._0_4_;
  auVar284._8_4_ = auVar217._0_4_;
  auVar284._12_4_ = auVar217._0_4_;
  auVar121 = vshufps_avx(auVar217,auVar217,0x55);
  auVar89 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar84 = auVar89._0_4_;
  auVar275._0_4_ = fVar84 * auVar256._0_4_;
  fVar119 = auVar89._4_4_;
  auVar275._4_4_ = fVar119 * auVar256._4_4_;
  fVar85 = auVar89._8_4_;
  auVar275._8_4_ = fVar85 * auVar256._8_4_;
  fVar152 = auVar89._12_4_;
  auVar275._12_4_ = fVar152 * auVar256._12_4_;
  auVar267._0_4_ = auVar5._0_4_ * fVar84;
  auVar267._4_4_ = auVar5._4_4_ * fVar119;
  auVar267._8_4_ = auVar5._8_4_ * fVar85;
  auVar267._12_4_ = auVar5._12_4_ * fVar152;
  auVar253._0_4_ = auVar158._0_4_ * fVar84;
  auVar253._4_4_ = auVar158._4_4_ * fVar119;
  auVar253._8_4_ = auVar158._8_4_ * fVar85;
  auVar253._12_4_ = auVar158._12_4_ * fVar152;
  auVar89 = vfmadd231ps_fma(auVar275,auVar121,auVar202);
  auVar122 = vfmadd231ps_fma(auVar267,auVar121,auVar129);
  auVar121 = vfmadd231ps_fma(auVar253,auVar90,auVar121);
  auVar176 = vfmadd231ps_fma(auVar89,auVar284,auVar96);
  auVar122 = vfmadd231ps_fma(auVar122,auVar284,auVar4);
  auVar200 = vfmadd231ps_fma(auVar121,auVar91,auVar284);
  auVar285._4_4_ = auVar88._0_4_;
  auVar285._0_4_ = auVar88._0_4_;
  auVar285._8_4_ = auVar88._0_4_;
  auVar285._12_4_ = auVar88._0_4_;
  auVar121 = vshufps_avx(auVar88,auVar88,0x55);
  auVar89 = vshufps_avx(auVar88,auVar88,0xaa);
  fVar84 = auVar89._0_4_;
  auVar218._0_4_ = fVar84 * auVar256._0_4_;
  fVar119 = auVar89._4_4_;
  auVar218._4_4_ = fVar119 * auVar256._4_4_;
  fVar85 = auVar89._8_4_;
  auVar218._8_4_ = fVar85 * auVar256._8_4_;
  fVar152 = auVar89._12_4_;
  auVar218._12_4_ = fVar152 * auVar256._12_4_;
  auVar120._0_4_ = auVar5._0_4_ * fVar84;
  auVar120._4_4_ = auVar5._4_4_ * fVar119;
  auVar120._8_4_ = auVar5._8_4_ * fVar85;
  auVar120._12_4_ = auVar5._12_4_ * fVar152;
  auVar89._0_4_ = auVar158._0_4_ * fVar84;
  auVar89._4_4_ = auVar158._4_4_ * fVar119;
  auVar89._8_4_ = auVar158._8_4_ * fVar85;
  auVar89._12_4_ = auVar158._12_4_ * fVar152;
  auVar202 = vfmadd231ps_fma(auVar218,auVar121,auVar202);
  auVar256 = vfmadd231ps_fma(auVar120,auVar121,auVar129);
  auVar129 = vfmadd231ps_fma(auVar89,auVar121,auVar90);
  auVar5 = vfmadd231ps_fma(auVar202,auVar285,auVar96);
  auVar90 = vfmadd231ps_fma(auVar256,auVar285,auVar4);
  auVar158 = vfmadd231ps_fma(auVar129,auVar285,auVar91);
  local_920._8_4_ = 0x7fffffff;
  local_920._0_8_ = 0x7fffffff7fffffff;
  local_920._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar176,local_920);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar199,1);
  auVar202 = vblendvps_avx(auVar176,auVar199,auVar96);
  auVar96 = vandps_avx(auVar122,local_920);
  auVar96 = vcmpps_avx(auVar96,auVar199,1);
  auVar256 = vblendvps_avx(auVar122,auVar199,auVar96);
  auVar96 = vandps_avx(auVar200,local_920);
  auVar96 = vcmpps_avx(auVar96,auVar199,1);
  auVar96 = vblendvps_avx(auVar200,auVar199,auVar96);
  auVar4 = vrcpps_avx(auVar202);
  auVar241._8_4_ = 0x3f800000;
  auVar241._0_8_ = &DAT_3f8000003f800000;
  auVar241._12_4_ = 0x3f800000;
  auVar202 = vfnmadd213ps_fma(auVar202,auVar4,auVar241);
  auVar4 = vfmadd132ps_fma(auVar202,auVar4,auVar4);
  auVar202 = vrcpps_avx(auVar256);
  auVar256 = vfnmadd213ps_fma(auVar256,auVar202,auVar241);
  auVar129 = vfmadd132ps_fma(auVar256,auVar202,auVar202);
  auVar202 = vrcpps_avx(auVar96);
  auVar256 = vfnmadd213ps_fma(auVar96,auVar202,auVar241);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar91 = vfmadd132ps_fma(auVar256,auVar202,auVar202);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar5);
  auVar200._0_4_ = auVar4._0_4_ * auVar96._0_4_;
  auVar200._4_4_ = auVar4._4_4_ * auVar96._4_4_;
  auVar200._8_4_ = auVar4._8_4_ * auVar96._8_4_;
  auVar200._12_4_ = auVar4._12_4_ * auVar96._12_4_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar202);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar5);
  auVar219._0_4_ = auVar4._0_4_ * auVar96._0_4_;
  auVar219._4_4_ = auVar4._4_4_ * auVar96._4_4_;
  auVar219._8_4_ = auVar4._8_4_ * auVar96._8_4_;
  auVar219._12_4_ = auVar4._12_4_ * auVar96._12_4_;
  auVar122._1_3_ = 0;
  auVar122[0] = PVar1;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar202 = vpmovsxwd_avx(auVar256);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar83 * -2 + 6);
  auVar96 = vpmovsxwd_avx(auVar4);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar90);
  auVar254._0_4_ = auVar96._0_4_ * auVar129._0_4_;
  auVar254._4_4_ = auVar96._4_4_ * auVar129._4_4_;
  auVar254._8_4_ = auVar96._8_4_ * auVar129._8_4_;
  auVar254._12_4_ = auVar96._12_4_ * auVar129._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar202);
  auVar96 = vsubps_avx(auVar96,auVar90);
  auVar121._0_4_ = auVar129._0_4_ * auVar96._0_4_;
  auVar121._4_4_ = auVar129._4_4_ * auVar96._4_4_;
  auVar121._8_4_ = auVar129._8_4_ * auVar96._8_4_;
  auVar121._12_4_ = auVar129._12_4_ * auVar96._12_4_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar78 + uVar83 + 6);
  auVar96 = vpmovsxwd_avx(auVar129);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar158);
  auVar176._0_4_ = auVar91._0_4_ * auVar96._0_4_;
  auVar176._4_4_ = auVar91._4_4_ * auVar96._4_4_;
  auVar176._8_4_ = auVar91._8_4_ * auVar96._8_4_;
  auVar176._12_4_ = auVar91._12_4_ * auVar96._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar5);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar158);
  auVar90._0_4_ = auVar91._0_4_ * auVar96._0_4_;
  auVar90._4_4_ = auVar91._4_4_ * auVar96._4_4_;
  auVar90._8_4_ = auVar91._8_4_ * auVar96._8_4_;
  auVar90._12_4_ = auVar91._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar200,auVar219);
  auVar202 = vpminsd_avx(auVar254,auVar121);
  auVar96 = vmaxps_avx(auVar96,auVar202);
  auVar202 = vpminsd_avx(auVar176,auVar90);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar263._4_4_ = uVar81;
  auVar263._0_4_ = uVar81;
  auVar263._8_4_ = uVar81;
  auVar263._12_4_ = uVar81;
  auVar202 = vmaxps_avx(auVar202,auVar263);
  auVar96 = vmaxps_avx(auVar96,auVar202);
  local_430._0_4_ = auVar96._0_4_ * 0.99999964;
  local_430._4_4_ = auVar96._4_4_ * 0.99999964;
  local_430._8_4_ = auVar96._8_4_ * 0.99999964;
  local_430._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar200,auVar219);
  auVar202 = vpmaxsd_avx(auVar254,auVar121);
  auVar96 = vminps_avx(auVar96,auVar202);
  auVar202 = vpmaxsd_avx(auVar176,auVar90);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar158._4_4_ = uVar81;
  auVar158._0_4_ = uVar81;
  auVar158._8_4_ = uVar81;
  auVar158._12_4_ = uVar81;
  auVar202 = vminps_avx(auVar202,auVar158);
  auVar96 = vminps_avx(auVar96,auVar202);
  auVar91._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar122[4] = PVar1;
  auVar122._5_3_ = 0;
  auVar122[8] = PVar1;
  auVar122._9_3_ = 0;
  auVar122[0xc] = PVar1;
  auVar122._13_3_ = 0;
  auVar202 = vpcmpgtd_avx(auVar122,_DAT_01ff0cf0);
  auVar96 = vcmpps_avx(local_430,auVar91,2);
  auVar96 = vandps_avx(auVar96,auVar202);
  uVar76 = vmovmskps_avx(auVar96);
  local_be9 = uVar76 != 0;
  if (uVar76 == 0) {
    return local_be9;
  }
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  uVar76 = uVar76 & 0xff;
  local_260 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_9f8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_7a0 = 0x7fffffff;
  uStack_79c = 0x7fffffff;
  uStack_798 = 0x7fffffff;
  uStack_794 = 0x7fffffff;
  uStack_790 = 0x7fffffff;
  uStack_78c = 0x7fffffff;
  uStack_788 = 0x7fffffff;
  uStack_784 = 0x7fffffff;
  local_810 = prim;
LAB_016e5e4d:
  lVar79 = 0;
  local_808 = (ulong)uVar76;
  for (uVar78 = local_808; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar79 = lVar79 + 1;
  }
  local_690 = *(uint *)(local_810 + 2);
  local_b50 = (ulong)local_690;
  local_6a0 = *(uint *)(local_810 + lVar79 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[local_b50].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_6a0);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar79 = *(long *)&pGVar2[1].time_range.upper;
  auVar96 = *(undefined1 (*) [16])(lVar79 + (long)p_Var3 * uVar78);
  auVar202 = *(undefined1 (*) [16])(lVar79 + (uVar78 + 1) * (long)p_Var3);
  auVar256 = *(undefined1 (*) [16])(lVar79 + (uVar78 + 2) * (long)p_Var3);
  local_808 = local_808 - 1 & local_808;
  auVar4 = *(undefined1 (*) [16])(lVar79 + (uVar78 + 3) * (long)p_Var3);
  if (local_808 != 0) {
    uVar83 = local_808 - 1 & local_808;
    for (uVar78 = local_808; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar129 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar5 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar220._4_4_ = uVar81;
  auVar220._0_4_ = uVar81;
  auVar220._8_4_ = uVar81;
  auVar220._12_4_ = uVar81;
  fStack_b30 = (float)uVar81;
  _local_b40 = auVar220;
  fStack_b2c = (float)uVar81;
  fStack_b28 = (float)uVar81;
  register0x0000135c = uVar81;
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar286._4_4_ = uVar81;
  auVar286._0_4_ = uVar81;
  auVar286._8_4_ = uVar81;
  auVar286._12_4_ = uVar81;
  fStack_8d0 = (float)uVar81;
  _local_8e0 = auVar286;
  fStack_8cc = (float)uVar81;
  fStack_8c8 = (float)uVar81;
  register0x0000159c = uVar81;
  auVar129 = vunpcklps_avx(auVar220,auVar286);
  fVar84 = *(float *)(ray + k * 4 + 0x60);
  auVar268._4_4_ = fVar84;
  auVar268._0_4_ = fVar84;
  auVar268._8_4_ = fVar84;
  auVar268._12_4_ = fVar84;
  local_9a0._16_4_ = fVar84;
  local_9a0._0_16_ = auVar268;
  local_9a0._20_4_ = fVar84;
  local_9a0._24_4_ = fVar84;
  local_9a0._28_4_ = fVar84;
  auVar271 = ZEXT3264(local_9a0);
  local_910 = vinsertps_avx(auVar129,auVar268,0x28);
  auVar221._0_4_ = (auVar96._0_4_ + auVar202._0_4_ + auVar256._0_4_ + auVar4._0_4_) * 0.25;
  auVar221._4_4_ = (auVar96._4_4_ + auVar202._4_4_ + auVar256._4_4_ + auVar4._4_4_) * 0.25;
  auVar221._8_4_ = (auVar96._8_4_ + auVar202._8_4_ + auVar256._8_4_ + auVar4._8_4_) * 0.25;
  auVar221._12_4_ = (auVar96._12_4_ + auVar202._12_4_ + auVar256._12_4_ + auVar4._12_4_) * 0.25;
  auVar129 = vsubps_avx(auVar221,auVar5);
  auVar129 = vdpps_avx(auVar129,local_910,0x7f);
  local_930 = vdpps_avx(local_910,local_910,0x7f);
  auVar266 = ZEXT1664(local_930);
  auVar91 = vrcpss_avx(local_930,local_930);
  auVar90 = vfnmadd213ss_fma(auVar91,local_930,ZEXT416(0x40000000));
  local_2e0 = auVar129._0_4_ * auVar91._0_4_ * auVar90._0_4_;
  auVar235._4_4_ = local_2e0;
  auVar235._0_4_ = local_2e0;
  auVar235._8_4_ = local_2e0;
  auVar235._12_4_ = local_2e0;
  fStack_8b0 = local_2e0;
  _local_8c0 = auVar235;
  fStack_8ac = local_2e0;
  fStack_8a8 = local_2e0;
  fStack_8a4 = local_2e0;
  auVar129 = vfmadd231ps_fma(auVar5,local_910,auVar235);
  auVar129 = vblendps_avx(auVar129,_DAT_01feba10,8);
  local_ab0 = vsubps_avx(auVar96,auVar129);
  auVar278 = ZEXT1664(local_ab0);
  local_ac0 = vsubps_avx(auVar256,auVar129);
  local_ad0 = vsubps_avx(auVar202,auVar129);
  _local_ae0 = vsubps_avx(auVar4,auVar129);
  auVar96 = vmovshdup_avx(local_ab0);
  local_400 = auVar96._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar96 = vshufps_avx(local_ab0,local_ab0,0xaa);
  uVar87 = auVar96._0_8_;
  local_900._8_8_ = uVar87;
  local_900._0_8_ = uVar87;
  local_900._16_8_ = uVar87;
  local_900._24_8_ = uVar87;
  auVar259 = ZEXT3264(local_900);
  auVar96 = vshufps_avx(local_ab0,local_ab0,0xff);
  local_5c0 = auVar96._0_8_;
  auVar96 = vmovshdup_avx(local_ad0);
  uVar87 = auVar96._0_8_;
  auVar269._8_8_ = uVar87;
  auVar269._0_8_ = uVar87;
  auVar269._16_8_ = uVar87;
  auVar269._24_8_ = uVar87;
  auVar96 = vshufps_avx(local_ad0,local_ad0,0xaa);
  uVar87 = auVar96._0_8_;
  auVar277._8_8_ = uVar87;
  auVar277._0_8_ = uVar87;
  auVar277._16_8_ = uVar87;
  auVar277._24_8_ = uVar87;
  auVar96 = vshufps_avx(local_ad0,local_ad0,0xff);
  uVar87 = auVar96._0_8_;
  auVar165._8_8_ = uVar87;
  auVar165._0_8_ = uVar87;
  auVar165._16_8_ = uVar87;
  auVar165._24_8_ = uVar87;
  auVar96 = vmovshdup_avx(local_ac0);
  local_3c0 = auVar96._0_4_;
  fStack_3bc = auVar96._4_4_;
  auVar96 = vshufps_avx(local_ac0,local_ac0,0xaa);
  uVar87 = auVar96._0_8_;
  local_a80._8_8_ = uVar87;
  local_a80._0_8_ = uVar87;
  local_a80._16_8_ = uVar87;
  local_a80._24_8_ = uVar87;
  auVar239 = ZEXT3264(local_a80);
  auVar96 = vshufps_avx(local_ac0,local_ac0,0xff);
  local_3e0 = auVar96._0_4_;
  fStack_3dc = auVar96._4_4_;
  auVar96 = vmovshdup_avx(_local_ae0);
  local_1a0 = auVar96._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar96 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  local_1c0 = auVar96._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar96 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  local_1e0 = auVar96._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar96 = vfmadd231ps_fma(ZEXT432((uint)(fVar84 * fVar84)),_local_8e0,_local_8e0);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),_local_b40,_local_b40);
  uVar81 = auVar96._0_4_;
  local_200._4_4_ = uVar81;
  local_200._0_4_ = uVar81;
  local_200._8_4_ = uVar81;
  local_200._12_4_ = uVar81;
  local_200._16_4_ = uVar81;
  local_200._20_4_ = uVar81;
  local_200._24_4_ = uVar81;
  local_200._28_4_ = uVar81;
  fVar84 = *(float *)(ray + k * 4 + 0x30);
  local_830 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar84 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_5e0 = 1;
  uVar78 = 0;
  uVar83 = 0;
  uVar81 = local_ab0._0_4_;
  local_280._4_4_ = uVar81;
  local_280._0_4_ = uVar81;
  local_280._8_4_ = uVar81;
  local_280._12_4_ = uVar81;
  local_280._16_4_ = uVar81;
  local_280._20_4_ = uVar81;
  local_280._24_4_ = uVar81;
  local_280._28_4_ = uVar81;
  uVar81 = local_ad0._0_4_;
  local_2a0._4_4_ = uVar81;
  local_2a0._0_4_ = uVar81;
  local_2a0._8_4_ = uVar81;
  local_2a0._12_4_ = uVar81;
  local_2a0._16_4_ = uVar81;
  local_2a0._20_4_ = uVar81;
  local_2a0._24_4_ = uVar81;
  local_2a0._28_4_ = uVar81;
  local_220 = local_ac0._0_4_;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_2c0 = local_ae0._0_4_;
  auVar8._8_8_ = local_5c0;
  auVar8._0_8_ = local_5c0;
  auVar8._16_8_ = local_5c0;
  auVar8._24_8_ = local_5c0;
  auVar194._4_4_ = uStack_79c;
  auVar194._0_4_ = local_7a0;
  auVar194._8_4_ = uStack_798;
  auVar194._12_4_ = uStack_794;
  auVar194._16_4_ = uStack_790;
  auVar194._20_4_ = uStack_78c;
  auVar194._24_4_ = uStack_788;
  auVar194._28_4_ = uStack_784;
  local_420 = vandps_avx(local_200,auVar194);
  auVar96 = vsqrtss_avx(local_930,local_930);
  local_b44 = auVar96._0_4_;
  auVar96 = vsqrtss_avx(local_930,local_930);
  local_b48 = auVar96._0_4_;
  local_820 = ZEXT816(0x3f80000000000000);
  auVar103._8_8_ = local_400;
  auVar103._0_8_ = local_400;
  auVar103._16_8_ = local_400;
  auVar103._24_8_ = local_400;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_b00 = auVar165;
  local_a40 = auVar277;
  local_a20 = auVar269;
  uStack_69c = local_6a0;
  uStack_698 = local_6a0;
  uStack_694 = local_6a0;
  uStack_68c = local_690;
  uStack_688 = local_690;
  uStack_684 = local_690;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  fStack_3b8 = local_3c0;
  fStack_3b4 = fStack_3bc;
  fStack_3b0 = local_3c0;
  fStack_3ac = fStack_3bc;
  fStack_3a8 = local_3c0;
  fStack_3a4 = fStack_3bc;
  do {
    auVar96 = vmovshdup_avx(local_820);
    local_720._0_4_ = local_820._0_4_;
    fVar153 = auVar96._0_4_ - local_720._0_4_;
    fVar157 = fVar153 * 0.04761905;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    auVar100._4_4_ = fVar153;
    auVar100._0_4_ = fVar153;
    auVar100._8_4_ = fVar153;
    auVar100._12_4_ = fVar153;
    auVar100._16_4_ = fVar153;
    auVar100._20_4_ = fVar153;
    auVar100._24_4_ = fVar153;
    auVar100._28_4_ = fVar153;
    auStack_730 = auVar100._16_16_;
    auVar96 = vfmadd231ps_fma(local_720,auVar100,_DAT_02020f20);
    auVar142._8_4_ = 0x3f800000;
    auVar142._0_8_ = &DAT_3f8000003f800000;
    auVar142._12_4_ = 0x3f800000;
    auVar142._16_4_ = 0x3f800000;
    auVar142._20_4_ = 0x3f800000;
    auVar142._24_4_ = 0x3f800000;
    auVar142._28_4_ = 0x3f800000;
    auVar111 = vsubps_avx(auVar142,ZEXT1632(auVar96));
    fVar119 = auVar96._0_4_;
    auVar283._0_4_ = local_2a0._0_4_ * fVar119;
    fVar85 = auVar96._4_4_;
    auVar283._4_4_ = local_2a0._4_4_ * fVar85;
    fVar152 = auVar96._8_4_;
    auVar283._8_4_ = local_2a0._8_4_ * fVar152;
    fVar86 = auVar96._12_4_;
    auVar283._12_4_ = local_2a0._12_4_ * fVar86;
    auVar283._16_4_ = local_2a0._16_4_ * 0.0;
    auVar283._20_4_ = local_2a0._20_4_ * 0.0;
    auVar283._28_36_ = auVar278._28_36_;
    auVar283._24_4_ = local_2a0._24_4_ * 0.0;
    auVar278._0_4_ = auVar269._0_4_ * fVar119;
    auVar278._4_4_ = auVar269._4_4_ * fVar85;
    auVar278._8_4_ = auVar269._8_4_ * fVar152;
    auVar278._12_4_ = auVar269._12_4_ * fVar86;
    auVar278._16_4_ = auVar269._16_4_ * 0.0;
    auVar278._20_4_ = auVar269._20_4_ * 0.0;
    auVar278._28_36_ = auVar271._28_36_;
    auVar278._24_4_ = auVar269._24_4_ * 0.0;
    auVar271._0_4_ = auVar277._0_4_ * fVar119;
    auVar271._4_4_ = auVar277._4_4_ * fVar85;
    auVar271._8_4_ = auVar277._8_4_ * fVar152;
    auVar271._12_4_ = auVar277._12_4_ * fVar86;
    auVar271._16_4_ = auVar277._16_4_ * 0.0;
    auVar271._20_4_ = auVar277._20_4_ * 0.0;
    auVar271._28_36_ = auVar266._28_36_;
    auVar271._24_4_ = auVar277._24_4_ * 0.0;
    auVar167._4_4_ = auVar165._4_4_ * fVar85;
    auVar167._0_4_ = auVar165._0_4_ * fVar119;
    auVar167._8_4_ = auVar165._8_4_ * fVar152;
    auVar167._12_4_ = auVar165._12_4_ * fVar86;
    auVar167._16_4_ = auVar165._16_4_ * 0.0;
    auVar167._20_4_ = auVar165._20_4_ * 0.0;
    auVar167._24_4_ = auVar165._24_4_ * 0.0;
    auVar167._28_4_ = fVar153;
    auVar96 = vfmadd231ps_fma(auVar283._0_32_,auVar111,local_280);
    auVar202 = vfmadd231ps_fma(auVar278._0_32_,auVar111,auVar103);
    auVar256 = vfmadd231ps_fma(auVar271._0_32_,auVar111,auVar259._0_32_);
    auVar4 = vfmadd231ps_fma(auVar167,auVar111,auVar8);
    auVar72._4_4_ = fStack_21c;
    auVar72._0_4_ = local_220;
    auVar72._8_4_ = fStack_218;
    auVar72._12_4_ = fStack_214;
    auVar72._16_4_ = fStack_210;
    auVar72._20_4_ = fStack_20c;
    auVar72._24_4_ = fStack_208;
    auVar72._28_4_ = fStack_204;
    auVar266._0_4_ = local_220 * fVar119;
    auVar266._4_4_ = fStack_21c * fVar85;
    auVar266._8_4_ = fStack_218 * fVar152;
    auVar266._12_4_ = fStack_214 * fVar86;
    auVar266._16_4_ = fStack_210 * 0.0;
    auVar266._20_4_ = fStack_20c * 0.0;
    auVar266._28_36_ = auVar259._28_36_;
    auVar266._24_4_ = fStack_208 * 0.0;
    auVar9._4_4_ = fVar85 * fStack_3bc;
    auVar9._0_4_ = fVar119 * local_3c0;
    auVar9._8_4_ = fVar152 * fStack_3b8;
    auVar9._12_4_ = fVar86 * fStack_3b4;
    auVar9._16_4_ = fStack_3b0 * 0.0;
    auVar9._20_4_ = fStack_3ac * 0.0;
    auVar9._24_4_ = fStack_3a8 * 0.0;
    auVar9._28_4_ = local_280._28_4_;
    auVar229._4_4_ = auVar239._4_4_ * fVar85;
    auVar229._0_4_ = auVar239._0_4_ * fVar119;
    auVar229._8_4_ = auVar239._8_4_ * fVar152;
    auVar229._12_4_ = auVar239._12_4_ * fVar86;
    auVar229._16_4_ = auVar239._16_4_ * 0.0;
    auVar229._20_4_ = auVar239._20_4_ * 0.0;
    auVar229._24_4_ = auVar239._24_4_ * 0.0;
    auVar229._28_4_ = auVar103._28_4_;
    auVar101._4_4_ = fVar85 * fStack_3dc;
    auVar101._0_4_ = fVar119 * local_3e0;
    auVar101._8_4_ = fVar152 * fStack_3d8;
    auVar101._12_4_ = fVar86 * fStack_3d4;
    auVar101._16_4_ = fStack_3d0 * 0.0;
    auVar101._20_4_ = fStack_3cc * 0.0;
    auVar101._24_4_ = fStack_3c8 * 0.0;
    auVar101._28_4_ = auVar8._28_4_;
    auVar129 = vfmadd231ps_fma(auVar266._0_32_,auVar111,local_2a0);
    auVar5 = vfmadd231ps_fma(auVar9,auVar111,auVar269);
    auVar91 = vfmadd231ps_fma(auVar229,auVar111,auVar277);
    auVar90 = vfmadd231ps_fma(auVar101,auVar111,auVar165);
    auVar10._4_4_ = fStack_2bc * fVar85;
    auVar10._0_4_ = local_2c0 * fVar119;
    auVar10._8_4_ = fStack_2b8 * fVar152;
    auVar10._12_4_ = fStack_2b4 * fVar86;
    auVar10._16_4_ = fStack_2b0 * 0.0;
    auVar10._20_4_ = fStack_2ac * 0.0;
    auVar10._24_4_ = fStack_2a8 * 0.0;
    auVar10._28_4_ = auVar269._28_4_;
    auVar11._4_4_ = fVar85 * local_1a0._4_4_;
    auVar11._0_4_ = fVar119 * (float)local_1a0;
    auVar11._8_4_ = fVar152 * (float)uStack_198;
    auVar11._12_4_ = fVar86 * uStack_198._4_4_;
    auVar11._16_4_ = (float)uStack_190 * 0.0;
    auVar11._20_4_ = uStack_190._4_4_ * 0.0;
    auVar11._24_4_ = (float)uStack_188 * 0.0;
    auVar11._28_4_ = auVar277._28_4_;
    auVar239._0_28_ =
         ZEXT1628(CONCAT412(auVar129._12_4_ * fVar86,
                            CONCAT48(auVar129._8_4_ * fVar152,
                                     CONCAT44(auVar129._4_4_ * fVar85,auVar129._0_4_ * fVar119))));
    auVar96 = vfmadd231ps_fma(auVar239._0_32_,auVar111,ZEXT1632(auVar96));
    auVar202 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar5._12_4_,
                                                  CONCAT48(fVar152 * auVar5._8_4_,
                                                           CONCAT44(fVar85 * auVar5._4_4_,
                                                                    fVar119 * auVar5._0_4_)))),
                               auVar111,ZEXT1632(auVar202));
    auVar256 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar91._12_4_,
                                                  CONCAT48(fVar152 * auVar91._8_4_,
                                                           CONCAT44(fVar85 * auVar91._4_4_,
                                                                    fVar119 * auVar91._0_4_)))),
                               auVar111,ZEXT1632(auVar256));
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar90._12_4_,
                                                CONCAT48(fVar152 * auVar90._8_4_,
                                                         CONCAT44(fVar85 * auVar90._4_4_,
                                                                  fVar119 * auVar90._0_4_)))),
                             auVar111,ZEXT1632(auVar4));
    auVar193._4_4_ = fVar85 * local_1c0._4_4_;
    auVar193._0_4_ = fVar119 * (float)local_1c0;
    auVar193._8_4_ = fVar152 * (float)uStack_1b8;
    auVar193._12_4_ = fVar86 * uStack_1b8._4_4_;
    auVar193._16_4_ = (float)uStack_1b0 * 0.0;
    auVar193._20_4_ = uStack_1b0._4_4_ * 0.0;
    auVar193._24_4_ = (float)uStack_1a8 * 0.0;
    auVar193._28_4_ = local_2a0._28_4_;
    auVar158 = vfmadd231ps_fma(auVar10,auVar111,auVar72);
    auVar129 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar158._12_4_ * fVar86,
                                                  CONCAT48(auVar158._8_4_ * fVar152,
                                                           CONCAT44(auVar158._4_4_ * fVar85,
                                                                    auVar158._0_4_ * fVar119)))),
                               auVar111,ZEXT1632(auVar129));
    auVar257._0_4_ = fVar119 * (float)local_1e0;
    auVar257._4_4_ = fVar85 * local_1e0._4_4_;
    auVar257._8_4_ = fVar152 * (float)uStack_1d8;
    auVar257._12_4_ = fVar86 * uStack_1d8._4_4_;
    auVar257._16_4_ = (float)uStack_1d0 * 0.0;
    auVar257._20_4_ = uStack_1d0._4_4_ * 0.0;
    auVar257._24_4_ = (float)uStack_1c8 * 0.0;
    auVar257._28_4_ = 0;
    auVar70._4_4_ = fStack_3bc;
    auVar70._0_4_ = local_3c0;
    auVar70._8_4_ = fStack_3b8;
    auVar70._12_4_ = fStack_3b4;
    auVar70._16_4_ = fStack_3b0;
    auVar70._20_4_ = fStack_3ac;
    auVar70._24_4_ = fStack_3a8;
    auVar70._28_4_ = fStack_3a4;
    auVar158 = vfmadd231ps_fma(auVar11,auVar111,auVar70);
    auVar121 = vfmadd231ps_fma(auVar193,auVar111,local_a80);
    auVar190._4_4_ = fStack_3dc;
    auVar190._0_4_ = local_3e0;
    auVar190._8_4_ = fStack_3d8;
    auVar190._12_4_ = fStack_3d4;
    auVar190._16_4_ = fStack_3d0;
    auVar190._20_4_ = fStack_3cc;
    auVar190._24_4_ = fStack_3c8;
    auVar190._28_4_ = fStack_3c4;
    auVar89 = vfmadd231ps_fma(auVar257,auVar111,auVar190);
    auVar12._28_4_ = fStack_2a4;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(auVar89._12_4_ * fVar86,
                            CONCAT48(auVar89._8_4_ * fVar152,
                                     CONCAT44(auVar89._4_4_ * fVar85,auVar89._0_4_ * fVar119))));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar158._12_4_ * fVar86,
                                                CONCAT48(auVar158._8_4_ * fVar152,
                                                         CONCAT44(auVar158._4_4_ * fVar85,
                                                                  auVar158._0_4_ * fVar119)))),
                             auVar111,ZEXT1632(auVar5));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar121._12_4_,
                                                 CONCAT48(fVar152 * auVar121._8_4_,
                                                          CONCAT44(fVar85 * auVar121._4_4_,
                                                                   fVar119 * auVar121._0_4_)))),
                              auVar111,ZEXT1632(auVar91));
    auVar90 = vfmadd231ps_fma(auVar12,auVar111,ZEXT1632(auVar90));
    auVar13._28_4_ = fStack_204;
    auVar13._0_28_ =
         ZEXT1628(CONCAT412(auVar5._12_4_ * fVar86,
                            CONCAT48(auVar5._8_4_ * fVar152,
                                     CONCAT44(auVar5._4_4_ * fVar85,auVar5._0_4_ * fVar119))));
    auVar104._28_4_ = auVar165._28_4_;
    auVar104._0_28_ =
         ZEXT1628(CONCAT412(fVar86 * auVar91._12_4_,
                            CONCAT48(fVar152 * auVar91._8_4_,
                                     CONCAT44(fVar85 * auVar91._4_4_,fVar119 * auVar91._0_4_))));
    auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar129._12_4_ * fVar86,
                                                  CONCAT48(auVar129._8_4_ * fVar152,
                                                           CONCAT44(auVar129._4_4_ * fVar85,
                                                                    auVar129._0_4_ * fVar119)))),
                               auVar111,ZEXT1632(auVar96));
    auVar121 = vfmadd231ps_fma(auVar13,auVar111,ZEXT1632(auVar202));
    auVar101 = ZEXT1632(auVar121);
    auVar121 = vfmadd231ps_fma(auVar104,auVar111,ZEXT1632(auVar256));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar90._12_4_ * fVar86,
                                                 CONCAT48(auVar90._8_4_ * fVar152,
                                                          CONCAT44(auVar90._4_4_ * fVar85,
                                                                   auVar90._0_4_ * fVar119)))),
                              ZEXT1632(auVar4),auVar111);
    auVar8 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar96));
    auVar111 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar202));
    auVar103 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar256));
    auVar277 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar4));
    local_a60._0_4_ = fVar157 * auVar8._0_4_ * 3.0;
    local_a60._4_4_ = fVar157 * auVar8._4_4_ * 3.0;
    local_a60._8_4_ = fVar157 * auVar8._8_4_ * 3.0;
    local_a60._12_4_ = fVar157 * auVar8._12_4_ * 3.0;
    local_a60._16_4_ = fVar157 * auVar8._16_4_ * 3.0;
    local_a60._20_4_ = fVar157 * auVar8._20_4_ * 3.0;
    local_a60._24_4_ = fVar157 * auVar8._24_4_ * 3.0;
    local_a60._28_4_ = 0;
    local_6c0._0_4_ = fVar157 * auVar111._0_4_ * 3.0;
    local_6c0._4_4_ = fVar157 * auVar111._4_4_ * 3.0;
    local_6c0._8_4_ = fVar157 * auVar111._8_4_ * 3.0;
    local_6c0._12_4_ = fVar157 * auVar111._12_4_ * 3.0;
    local_6c0._16_4_ = fVar157 * auVar111._16_4_ * 3.0;
    local_6c0._20_4_ = fVar157 * auVar111._20_4_ * 3.0;
    local_6c0._24_4_ = fVar157 * auVar111._24_4_ * 3.0;
    local_6c0._28_4_ = 0;
    local_980._0_4_ = fVar157 * auVar103._0_4_ * 3.0;
    local_980._4_4_ = fVar157 * auVar103._4_4_ * 3.0;
    local_980._8_4_ = fVar157 * auVar103._8_4_ * 3.0;
    local_980._12_4_ = fVar157 * auVar103._12_4_ * 3.0;
    local_980._16_4_ = fVar157 * auVar103._16_4_ * 3.0;
    local_980._20_4_ = fVar157 * auVar103._20_4_ * 3.0;
    local_980._24_4_ = fVar157 * auVar103._24_4_ * 3.0;
    local_980._28_4_ = 0;
    fVar119 = fVar157 * auVar277._0_4_ * 3.0;
    fVar152 = fVar157 * auVar277._4_4_ * 3.0;
    auVar288._4_4_ = fVar152;
    auVar288._0_4_ = fVar119;
    fVar153 = fVar157 * auVar277._8_4_ * 3.0;
    auVar288._8_4_ = fVar153;
    fVar154 = fVar157 * auVar277._12_4_ * 3.0;
    auVar288._12_4_ = fVar154;
    fVar155 = fVar157 * auVar277._16_4_ * 3.0;
    auVar288._16_4_ = fVar155;
    fVar156 = fVar157 * auVar277._20_4_ * 3.0;
    auVar288._20_4_ = fVar156;
    fVar157 = fVar157 * auVar277._24_4_ * 3.0;
    auVar288._24_4_ = fVar157;
    auVar288._28_4_ = auVar8._28_4_;
    auVar190 = ZEXT1632(auVar158);
    auVar193 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar158));
    local_860._0_32_ = vpermps_avx2(_DAT_0205d4a0,auVar101);
    _local_880 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar121));
    auVar269 = vsubps_avx(auVar193,auVar190);
    auVar165 = vsubps_avx(_local_880,ZEXT1632(auVar121));
    fVar172 = auVar165._0_4_;
    fVar173 = auVar165._4_4_;
    auVar6._4_4_ = fVar173 * local_a60._4_4_;
    auVar6._0_4_ = fVar172 * local_a60._0_4_;
    fVar174 = auVar165._8_4_;
    auVar6._8_4_ = fVar174 * local_a60._8_4_;
    fVar175 = auVar165._12_4_;
    auVar6._12_4_ = fVar175 * local_a60._12_4_;
    fVar215 = auVar165._16_4_;
    auVar6._16_4_ = fVar215 * local_a60._16_4_;
    fVar216 = auVar165._20_4_;
    auVar6._20_4_ = fVar216 * local_a60._20_4_;
    fVar234 = auVar165._24_4_;
    auVar6._24_4_ = fVar234 * local_a60._24_4_;
    auVar6._28_4_ = local_880._28_4_;
    auVar96 = vfmsub231ps_fma(auVar6,local_980,auVar269);
    auVar194 = vsubps_avx(local_860._0_32_,auVar101);
    fVar252 = auVar269._0_4_;
    fVar260 = auVar269._4_4_;
    auVar7._4_4_ = fVar260 * local_6c0._4_4_;
    auVar7._0_4_ = fVar252 * local_6c0._0_4_;
    fVar272 = auVar269._8_4_;
    auVar7._8_4_ = fVar272 * local_6c0._8_4_;
    fVar273 = auVar269._12_4_;
    auVar7._12_4_ = fVar273 * local_6c0._12_4_;
    fVar274 = auVar269._16_4_;
    auVar7._16_4_ = fVar274 * local_6c0._16_4_;
    fVar279 = auVar269._20_4_;
    auVar7._20_4_ = fVar279 * local_6c0._20_4_;
    fVar280 = auVar269._24_4_;
    auVar7._24_4_ = fVar280 * local_6c0._24_4_;
    auVar7._28_4_ = auVar193._28_4_;
    auVar202 = vfmsub231ps_fma(auVar7,local_a60,auVar194);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar202._12_4_ * auVar202._12_4_,
                                                 CONCAT48(auVar202._8_4_ * auVar202._8_4_,
                                                          CONCAT44(auVar202._4_4_ * auVar202._4_4_,
                                                                   auVar202._0_4_ * auVar202._0_4_))
                                                )),ZEXT1632(auVar96),ZEXT1632(auVar96));
    fVar198 = auVar194._0_4_;
    fVar211 = auVar194._4_4_;
    auVar15._4_4_ = fVar211 * local_980._4_4_;
    auVar15._0_4_ = fVar198 * local_980._0_4_;
    fVar212 = auVar194._8_4_;
    auVar15._8_4_ = fVar212 * local_980._8_4_;
    fVar213 = auVar194._12_4_;
    auVar15._12_4_ = fVar213 * local_980._12_4_;
    fVar214 = auVar194._16_4_;
    auVar15._16_4_ = fVar214 * local_980._16_4_;
    fVar240 = auVar194._20_4_;
    auVar15._20_4_ = fVar240 * local_980._20_4_;
    fVar246 = auVar194._24_4_;
    auVar15._24_4_ = fVar246 * local_980._24_4_;
    auVar15._28_4_ = local_860._28_4_;
    auVar256 = vfmsub231ps_fma(auVar15,local_6c0,auVar165);
    auVar191._0_4_ = fVar172 * fVar172;
    auVar191._4_4_ = fVar173 * fVar173;
    auVar191._8_4_ = fVar174 * fVar174;
    auVar191._12_4_ = fVar175 * fVar175;
    auVar191._16_4_ = fVar215 * fVar215;
    auVar191._20_4_ = fVar216 * fVar216;
    auVar191._24_4_ = fVar234 * fVar234;
    auVar191._28_4_ = 0;
    auVar202 = vfmadd231ps_fma(auVar191,auVar194,auVar194);
    auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar269,auVar269);
    auVar111 = vrcpps_avx(ZEXT1632(auVar202));
    auVar256 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar256),ZEXT1632(auVar256));
    auVar265._8_4_ = 0x3f800000;
    auVar265._0_8_ = &DAT_3f8000003f800000;
    auVar265._12_4_ = 0x3f800000;
    auVar265._16_4_ = 0x3f800000;
    auVar265._20_4_ = 0x3f800000;
    auVar265._24_4_ = 0x3f800000;
    auVar265._28_4_ = 0x3f800000;
    auVar96 = vfnmadd213ps_fma(auVar111,ZEXT1632(auVar202),auVar265);
    auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar111,auVar111);
    local_b20 = vpermps_avx2(_DAT_0205d4a0,local_a60);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_980);
    auVar16._4_4_ = fVar173 * local_b20._4_4_;
    auVar16._0_4_ = fVar172 * local_b20._0_4_;
    auVar16._8_4_ = fVar174 * local_b20._8_4_;
    auVar16._12_4_ = fVar175 * local_b20._12_4_;
    auVar16._16_4_ = fVar215 * local_b20._16_4_;
    auVar16._20_4_ = fVar216 * local_b20._20_4_;
    auVar16._24_4_ = fVar234 * local_b20._24_4_;
    auVar16._28_4_ = auVar111._28_4_;
    auVar4 = vfmsub231ps_fma(auVar16,local_960,auVar269);
    local_8a0 = vpermps_avx2(_DAT_0205d4a0,local_6c0);
    auVar17._4_4_ = fVar260 * local_8a0._4_4_;
    auVar17._0_4_ = fVar252 * local_8a0._0_4_;
    auVar17._8_4_ = fVar272 * local_8a0._8_4_;
    auVar17._12_4_ = fVar273 * local_8a0._12_4_;
    auVar17._16_4_ = fVar274 * local_8a0._16_4_;
    auVar17._20_4_ = fVar279 * local_8a0._20_4_;
    auVar17._24_4_ = fVar280 * local_8a0._24_4_;
    auVar17._28_4_ = 0;
    auVar129 = vfmsub231ps_fma(auVar17,local_b20,auVar194);
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar129._12_4_ * auVar129._12_4_,
                                                CONCAT48(auVar129._8_4_ * auVar129._8_4_,
                                                         CONCAT44(auVar129._4_4_ * auVar129._4_4_,
                                                                  auVar129._0_4_ * auVar129._0_4_)))
                                     ),ZEXT1632(auVar4),ZEXT1632(auVar4));
    fVar85 = local_960._0_4_;
    auVar226._0_4_ = fVar198 * fVar85;
    fVar86 = local_960._4_4_;
    auVar226._4_4_ = fVar211 * fVar86;
    fVar261 = local_960._8_4_;
    auVar226._8_4_ = fVar212 * fVar261;
    fVar262 = local_960._12_4_;
    auVar226._12_4_ = fVar213 * fVar262;
    fVar290 = local_960._16_4_;
    auVar226._16_4_ = fVar214 * fVar290;
    fVar291 = local_960._20_4_;
    auVar226._20_4_ = fVar240 * fVar291;
    fVar292 = local_960._24_4_;
    auVar226._24_4_ = fVar246 * fVar292;
    auVar226._28_4_ = 0;
    auVar129 = vfmsub231ps_fma(auVar226,local_8a0,auVar165);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar129),ZEXT1632(auVar129));
    auVar111 = vmaxps_avx(ZEXT1632(CONCAT412(auVar256._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar256._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar256._4_4_ * auVar96._4_4_,
                                                               auVar256._0_4_ * auVar96._0_4_)))),
                          ZEXT1632(CONCAT412(auVar4._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar4._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar4._4_4_ * auVar96._4_4_,
                                                               auVar4._0_4_ * auVar96._0_4_)))));
    auVar207._0_4_ = auVar89._0_4_ + fVar119;
    auVar207._4_4_ = auVar89._4_4_ + fVar152;
    auVar207._8_4_ = auVar89._8_4_ + fVar153;
    auVar207._12_4_ = auVar89._12_4_ + fVar154;
    auVar207._16_4_ = fVar155 + 0.0;
    auVar207._20_4_ = fVar156 + 0.0;
    auVar207._24_4_ = fVar157 + 0.0;
    auVar207._28_4_ = auVar8._28_4_ + 0.0;
    local_760 = ZEXT1632(auVar89);
    auVar8 = vsubps_avx(local_760,auVar288);
    auVar12 = vpermps_avx2(_DAT_0205d4a0,auVar8);
    auVar13 = vpermps_avx2(_DAT_0205d4a0,local_760);
    auVar8 = vmaxps_avx(local_760,auVar207);
    auVar103 = vmaxps_avx(auVar12,auVar13);
    auVar277 = vrsqrtps_avx(ZEXT1632(auVar202));
    auVar8 = vmaxps_avx(auVar8,auVar103);
    fVar119 = auVar277._0_4_;
    fVar152 = auVar277._4_4_;
    fVar157 = auVar277._8_4_;
    fVar153 = auVar277._12_4_;
    fVar154 = auVar277._16_4_;
    fVar155 = auVar277._20_4_;
    fVar156 = auVar277._24_4_;
    auVar18._4_4_ = fVar152 * fVar152 * fVar152 * auVar202._4_4_ * -0.5;
    auVar18._0_4_ = fVar119 * fVar119 * fVar119 * auVar202._0_4_ * -0.5;
    auVar18._8_4_ = fVar157 * fVar157 * fVar157 * auVar202._8_4_ * -0.5;
    auVar18._12_4_ = fVar153 * fVar153 * fVar153 * auVar202._12_4_ * -0.5;
    auVar18._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar18._20_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar18._24_4_ = fVar156 * fVar156 * fVar156 * -0.0;
    auVar18._28_4_ = local_b20._28_4_;
    auVar102._8_4_ = 0x3fc00000;
    auVar102._0_8_ = 0x3fc000003fc00000;
    auVar102._12_4_ = 0x3fc00000;
    auVar102._16_4_ = 0x3fc00000;
    auVar102._20_4_ = 0x3fc00000;
    auVar102._24_4_ = 0x3fc00000;
    auVar102._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_fma(auVar18,auVar102,auVar277);
    fVar152 = auVar96._0_4_;
    fVar157 = auVar96._4_4_;
    auVar19._4_4_ = fVar211 * fVar157;
    auVar19._0_4_ = fVar198 * fVar152;
    fVar154 = auVar96._8_4_;
    auVar19._8_4_ = fVar212 * fVar154;
    fVar156 = auVar96._12_4_;
    auVar19._12_4_ = fVar213 * fVar156;
    auVar19._16_4_ = fVar214 * 0.0;
    auVar19._20_4_ = fVar240 * 0.0;
    auVar19._24_4_ = fVar246 * 0.0;
    auVar19._28_4_ = 0;
    fVar240 = local_9a0._0_4_;
    fVar246 = local_9a0._4_4_;
    auVar20._4_4_ = fVar246 * fVar173 * fVar157;
    auVar20._0_4_ = fVar240 * fVar172 * fVar152;
    fVar247 = local_9a0._8_4_;
    auVar20._8_4_ = fVar247 * fVar174 * fVar154;
    fVar248 = local_9a0._12_4_;
    auVar20._12_4_ = fVar248 * fVar175 * fVar156;
    fVar249 = local_9a0._16_4_;
    auVar20._16_4_ = fVar249 * fVar215 * 0.0;
    fVar250 = local_9a0._20_4_;
    auVar20._20_4_ = fVar250 * fVar216 * 0.0;
    fVar251 = local_9a0._24_4_;
    auVar20._24_4_ = fVar251 * fVar234 * 0.0;
    auVar20._28_4_ = auVar165._28_4_;
    auVar202 = vfmadd231ps_fma(auVar20,auVar19,_local_8e0);
    auVar288 = ZEXT1632(auVar121);
    auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar167 = vsubps_avx(auVar103,auVar288);
    fVar198 = auVar167._0_4_;
    fVar211 = auVar167._4_4_;
    auVar21._4_4_ = fVar211 * fVar173 * fVar157;
    auVar21._0_4_ = fVar198 * fVar172 * fVar152;
    fVar212 = auVar167._8_4_;
    auVar21._8_4_ = fVar212 * fVar174 * fVar154;
    fVar213 = auVar167._12_4_;
    auVar21._12_4_ = fVar213 * fVar175 * fVar156;
    fVar214 = auVar167._16_4_;
    auVar21._16_4_ = fVar214 * fVar215 * 0.0;
    fVar215 = auVar167._20_4_;
    auVar21._20_4_ = fVar215 * fVar216 * 0.0;
    fVar216 = auVar167._24_4_;
    auVar21._24_4_ = fVar216 * fVar234 * 0.0;
    auVar21._28_4_ = auVar194._28_4_;
    auVar9 = vsubps_avx(auVar103,auVar101);
    auVar256 = vfmadd231ps_fma(auVar21,auVar9,auVar19);
    auVar22._4_4_ = fVar260 * fVar157;
    auVar22._0_4_ = fVar252 * fVar152;
    auVar22._8_4_ = fVar272 * fVar154;
    auVar22._12_4_ = fVar273 * fVar156;
    auVar22._16_4_ = fVar274 * 0.0;
    auVar22._20_4_ = fVar279 * 0.0;
    auVar22._24_4_ = fVar280 * 0.0;
    auVar22._28_4_ = auVar277._28_4_;
    auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar22,_local_b40);
    auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar229 = vsubps_avx(auVar104,auVar190);
    auVar256 = vfmadd231ps_fma(ZEXT1632(auVar256),auVar229,auVar22);
    auVar23._4_4_ = fVar246 * fVar211;
    auVar23._0_4_ = fVar240 * fVar198;
    auVar23._8_4_ = fVar247 * fVar212;
    auVar23._12_4_ = fVar248 * fVar213;
    auVar23._16_4_ = fVar249 * fVar214;
    auVar23._20_4_ = fVar250 * fVar215;
    auVar23._24_4_ = fVar251 * fVar216;
    auVar23._28_4_ = auVar277._28_4_;
    auVar4 = vfmadd231ps_fma(auVar23,_local_8e0,auVar9);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_b40,auVar229);
    fVar119 = auVar256._0_4_;
    fVar234 = auVar202._0_4_;
    fVar153 = auVar256._4_4_;
    fVar272 = auVar202._4_4_;
    fVar155 = auVar256._8_4_;
    fVar273 = auVar202._8_4_;
    fVar172 = auVar256._12_4_;
    fVar274 = auVar202._12_4_;
    auVar24._28_4_ = local_b40._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar274 * fVar172,
                            CONCAT48(fVar273 * fVar155,CONCAT44(fVar272 * fVar153,fVar234 * fVar119)
                                    )));
    auVar277 = vsubps_avx(ZEXT1632(auVar4),auVar24);
    auVar25._4_4_ = fVar211 * fVar211;
    auVar25._0_4_ = fVar198 * fVar198;
    auVar25._8_4_ = fVar212 * fVar212;
    auVar25._12_4_ = fVar213 * fVar213;
    auVar25._16_4_ = fVar214 * fVar214;
    auVar25._20_4_ = fVar215 * fVar215;
    auVar25._24_4_ = fVar216 * fVar216;
    auVar25._28_4_ = local_b40._28_4_;
    auVar4 = vfmadd231ps_fma(auVar25,auVar9,auVar9);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar229,auVar229);
    auVar26._28_4_ = auVar269._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * fVar172,
                            CONCAT48(fVar155 * fVar155,CONCAT44(fVar153 * fVar153,fVar119 * fVar119)
                                    )));
    auVar10 = vsubps_avx(ZEXT1632(auVar4),auVar26);
    auVar103 = vsqrtps_avx(auVar111);
    fVar119 = (auVar8._0_4_ + auVar103._0_4_) * 1.0000002;
    fVar153 = (auVar8._4_4_ + auVar103._4_4_) * 1.0000002;
    fVar155 = (auVar8._8_4_ + auVar103._8_4_) * 1.0000002;
    fVar172 = (auVar8._12_4_ + auVar103._12_4_) * 1.0000002;
    fVar173 = (auVar8._16_4_ + auVar103._16_4_) * 1.0000002;
    fVar174 = (auVar8._20_4_ + auVar103._20_4_) * 1.0000002;
    fVar175 = (auVar8._24_4_ + auVar103._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar153 * fVar153;
    auVar27._0_4_ = fVar119 * fVar119;
    auVar27._8_4_ = fVar155 * fVar155;
    auVar27._12_4_ = fVar172 * fVar172;
    auVar27._16_4_ = fVar173 * fVar173;
    auVar27._20_4_ = fVar174 * fVar174;
    auVar27._24_4_ = fVar175 * fVar175;
    auVar27._28_4_ = auVar8._28_4_ + auVar103._28_4_;
    fVar252 = auVar277._0_4_ + auVar277._0_4_;
    fVar260 = auVar277._4_4_ + auVar277._4_4_;
    local_240._0_8_ = CONCAT44(fVar260,fVar252);
    local_240._8_4_ = auVar277._8_4_ + auVar277._8_4_;
    local_240._12_4_ = auVar277._12_4_ + auVar277._12_4_;
    local_240._16_4_ = auVar277._16_4_ + auVar277._16_4_;
    local_240._20_4_ = auVar277._20_4_ + auVar277._20_4_;
    local_240._24_4_ = auVar277._24_4_ + auVar277._24_4_;
    local_240._28_4_ = auVar277._28_4_ + auVar277._28_4_;
    auVar8 = vsubps_avx(auVar10,auVar27);
    local_6e0 = ZEXT1632(auVar202);
    local_300 = ZEXT1632(CONCAT412(fVar274 * fVar274,
                                   CONCAT48(fVar273 * fVar273,
                                            CONCAT44(fVar272 * fVar272,fVar234 * fVar234))));
    auVar277 = vsubps_avx(local_200,local_300);
    auVar28._4_4_ = fVar260 * fVar260;
    auVar28._0_4_ = fVar252 * fVar252;
    auVar28._8_4_ = local_240._8_4_ * local_240._8_4_;
    auVar28._12_4_ = local_240._12_4_ * local_240._12_4_;
    auVar28._16_4_ = local_240._16_4_ * local_240._16_4_;
    auVar28._20_4_ = local_240._20_4_ * local_240._20_4_;
    auVar28._24_4_ = local_240._24_4_ * local_240._24_4_;
    auVar28._28_4_ = 0x3f800002;
    fVar153 = auVar277._0_4_;
    fVar155 = auVar277._4_4_;
    fVar172 = auVar277._8_4_;
    fVar173 = auVar277._12_4_;
    fVar174 = auVar277._16_4_;
    fVar175 = auVar277._20_4_;
    fVar234 = auVar277._24_4_;
    auVar29._4_4_ = auVar8._4_4_ * fVar155 * 4.0;
    auVar29._0_4_ = auVar8._0_4_ * fVar153 * 4.0;
    auVar29._8_4_ = auVar8._8_4_ * fVar172 * 4.0;
    auVar29._12_4_ = auVar8._12_4_ * fVar173 * 4.0;
    auVar29._16_4_ = auVar8._16_4_ * fVar174 * 4.0;
    auVar29._20_4_ = auVar8._20_4_ * fVar175 * 4.0;
    auVar29._24_4_ = auVar8._24_4_ * fVar234 * 4.0;
    auVar29._28_4_ = 0x40800000;
    auVar11 = vsubps_avx(auVar28,auVar29);
    auVar111 = vcmpps_avx(auVar11,auVar104,5);
    local_700 = ZEXT1632(auVar256);
    fVar119 = auVar277._28_4_;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
      local_aa0._8_4_ = 0x7f800000;
      local_aa0._0_8_ = 0x7f8000007f800000;
      local_aa0._12_4_ = 0x7f800000;
      local_aa0._16_4_ = 0x7f800000;
      local_aa0._20_4_ = 0x7f800000;
      local_aa0._24_4_ = 0x7f800000;
      local_aa0._28_4_ = 0x7f800000;
      auVar227._8_4_ = 0xff800000;
      auVar227._0_8_ = 0xff800000ff800000;
      auVar227._12_4_ = 0xff800000;
      auVar227._16_4_ = 0xff800000;
      auVar227._20_4_ = 0xff800000;
      auVar227._24_4_ = 0xff800000;
      auVar227._28_4_ = 0xff800000;
    }
    else {
      auVar7 = vsqrtps_avx(auVar11);
      auVar243._0_4_ = fVar153 + fVar153;
      auVar243._4_4_ = fVar155 + fVar155;
      auVar243._8_4_ = fVar172 + fVar172;
      auVar243._12_4_ = fVar173 + fVar173;
      auVar243._16_4_ = fVar174 + fVar174;
      auVar243._20_4_ = fVar175 + fVar175;
      auVar243._24_4_ = fVar234 + fVar234;
      auVar243._28_4_ = fVar119 + fVar119;
      auVar6 = vrcpps_avx(auVar243);
      auVar104 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
      auVar228._8_4_ = 0x3f800000;
      auVar228._0_8_ = &DAT_3f8000003f800000;
      auVar228._12_4_ = 0x3f800000;
      auVar228._16_4_ = 0x3f800000;
      auVar228._20_4_ = 0x3f800000;
      auVar228._24_4_ = 0x3f800000;
      auVar228._28_4_ = 0x3f800000;
      auVar202 = vfnmadd213ps_fma(auVar243,auVar6,auVar228);
      auVar202 = vfmadd132ps_fma(ZEXT1632(auVar202),auVar6,auVar6);
      auVar105._0_8_ = CONCAT44(fVar260,fVar252) ^ 0x8000000080000000;
      auVar105._8_4_ = -local_240._8_4_;
      auVar105._12_4_ = -local_240._12_4_;
      auVar105._16_4_ = -local_240._16_4_;
      auVar105._20_4_ = -local_240._20_4_;
      auVar105._24_4_ = -local_240._24_4_;
      auVar105._28_4_ = -local_240._28_4_;
      auVar11 = vsubps_avx(auVar105,auVar7);
      auVar30._4_4_ = auVar11._4_4_ * auVar202._4_4_;
      auVar30._0_4_ = auVar11._0_4_ * auVar202._0_4_;
      auVar30._8_4_ = auVar11._8_4_ * auVar202._8_4_;
      auVar30._12_4_ = auVar11._12_4_ * auVar202._12_4_;
      auVar30._16_4_ = auVar11._16_4_ * 0.0;
      auVar30._20_4_ = auVar11._20_4_ * 0.0;
      auVar30._24_4_ = auVar11._24_4_ * 0.0;
      auVar30._28_4_ = auVar11._28_4_;
      auVar11 = vsubps_avx(auVar7,local_240);
      auVar31._4_4_ = auVar11._4_4_ * auVar202._4_4_;
      auVar31._0_4_ = auVar11._0_4_ * auVar202._0_4_;
      auVar31._8_4_ = auVar11._8_4_ * auVar202._8_4_;
      auVar31._12_4_ = auVar11._12_4_ * auVar202._12_4_;
      auVar31._16_4_ = auVar11._16_4_ * 0.0;
      auVar31._20_4_ = auVar11._20_4_ * 0.0;
      auVar31._24_4_ = auVar11._24_4_ * 0.0;
      auVar31._28_4_ = auVar11._28_4_;
      auVar202 = vfmadd213ps_fma(local_6e0,auVar30,local_700);
      local_460 = ZEXT1632(CONCAT412(fVar156 * auVar202._12_4_,
                                     CONCAT48(fVar154 * auVar202._8_4_,
                                              CONCAT44(fVar157 * auVar202._4_4_,
                                                       fVar152 * auVar202._0_4_))));
      auVar202 = vfmadd213ps_fma(local_6e0,auVar31,local_700);
      local_480 = ZEXT1632(CONCAT412(fVar156 * auVar202._12_4_,
                                     CONCAT48(fVar154 * auVar202._8_4_,
                                              CONCAT44(fVar157 * auVar202._4_4_,
                                                       fVar152 * auVar202._0_4_))));
      auVar236._8_4_ = 0x7f800000;
      auVar236._0_8_ = 0x7f8000007f800000;
      auVar236._12_4_ = 0x7f800000;
      auVar236._16_4_ = 0x7f800000;
      auVar236._20_4_ = 0x7f800000;
      auVar236._24_4_ = 0x7f800000;
      auVar236._28_4_ = 0x7f800000;
      local_aa0 = vblendvps_avx(auVar236,auVar30,auVar104);
      auVar65._4_4_ = uStack_79c;
      auVar65._0_4_ = local_7a0;
      auVar65._8_4_ = uStack_798;
      auVar65._12_4_ = uStack_794;
      auVar65._16_4_ = uStack_790;
      auVar65._20_4_ = uStack_78c;
      auVar65._24_4_ = uStack_788;
      auVar65._28_4_ = uStack_784;
      auVar11 = vandps_avx(local_300,auVar65);
      auVar11 = vmaxps_avx(local_420,auVar11);
      auVar32._4_4_ = auVar11._4_4_ * 1.9073486e-06;
      auVar32._0_4_ = auVar11._0_4_ * 1.9073486e-06;
      auVar32._8_4_ = auVar11._8_4_ * 1.9073486e-06;
      auVar32._12_4_ = auVar11._12_4_ * 1.9073486e-06;
      auVar32._16_4_ = auVar11._16_4_ * 1.9073486e-06;
      auVar32._20_4_ = auVar11._20_4_ * 1.9073486e-06;
      auVar32._24_4_ = auVar11._24_4_ * 1.9073486e-06;
      auVar32._28_4_ = auVar11._28_4_;
      auVar11 = vandps_avx(auVar277,auVar65);
      auVar11 = vcmpps_avx(auVar11,auVar32,1);
      auVar106._8_4_ = 0xff800000;
      auVar106._0_8_ = 0xff800000ff800000;
      auVar106._12_4_ = 0xff800000;
      auVar106._16_4_ = 0xff800000;
      auVar106._20_4_ = 0xff800000;
      auVar106._24_4_ = 0xff800000;
      auVar106._28_4_ = 0xff800000;
      auVar227 = vblendvps_avx(auVar106,auVar31,auVar104);
      auVar6 = auVar104 & auVar11;
      if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0x7f,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0xbf,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0')
      {
        auVar111 = vandps_avx(auVar104,auVar11);
        auVar11 = vcmpps_avx(auVar8,ZEXT832(0) << 0x20,2);
        auVar270._8_4_ = 0xff800000;
        auVar270._0_8_ = 0xff800000ff800000;
        auVar270._12_4_ = 0xff800000;
        auVar270._16_4_ = 0xff800000;
        auVar270._20_4_ = 0xff800000;
        auVar270._24_4_ = 0xff800000;
        auVar270._28_4_ = 0xff800000;
        auVar289._8_4_ = 0x7f800000;
        auVar289._0_8_ = 0x7f8000007f800000;
        auVar289._12_4_ = 0x7f800000;
        auVar289._16_4_ = 0x7f800000;
        auVar289._20_4_ = 0x7f800000;
        auVar289._24_4_ = 0x7f800000;
        auVar289._28_4_ = 0x7f800000;
        auVar8 = vblendvps_avx(auVar289,auVar270,auVar11);
        auVar202 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar6 = vpmovsxwd_avx2(auVar202);
        local_aa0 = vblendvps_avx(local_aa0,auVar8,auVar6);
        auVar8 = vblendvps_avx(auVar270,auVar289,auVar11);
        auVar227 = vblendvps_avx(auVar227,auVar8,auVar6);
        auVar116._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
        auVar116._8_4_ = auVar111._8_4_ ^ 0xffffffff;
        auVar116._12_4_ = auVar111._12_4_ ^ 0xffffffff;
        auVar116._16_4_ = auVar111._16_4_ ^ 0xffffffff;
        auVar116._20_4_ = auVar111._20_4_ ^ 0xffffffff;
        auVar116._24_4_ = auVar111._24_4_ ^ 0xffffffff;
        auVar116._28_4_ = auVar111._28_4_ ^ 0xffffffff;
        auVar111 = vorps_avx(auVar11,auVar116);
        auVar111 = vandps_avx(auVar104,auVar111);
      }
    }
    auVar239 = ZEXT3264(local_a80);
    auVar8 = local_260 & auVar111;
    if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar8 >> 0x7f,0) == '\0') &&
          (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar8 >> 0xbf,0) == '\0') &&
        (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar8[0x1f]) {
      auVar259 = ZEXT3264(local_900);
      auVar271 = ZEXT3264(local_a20);
      auVar278 = ZEXT3264(local_a40);
      auVar266 = ZEXT3264(local_b00);
    }
    else {
      local_320 = ZEXT1632(auVar96);
      fVar252 = *(float *)(ray + k * 4 + 0x80) - (float)local_830._0_4_;
      auVar107._4_4_ = fVar252;
      auVar107._0_4_ = fVar252;
      auVar107._8_4_ = fVar252;
      auVar107._12_4_ = fVar252;
      auVar107._16_4_ = fVar252;
      auVar107._20_4_ = fVar252;
      auVar107._24_4_ = fVar252;
      auVar107._28_4_ = fVar252;
      auVar11 = vminps_avx(auVar107,auVar227);
      auVar33._4_4_ = fVar211 * local_980._4_4_;
      auVar33._0_4_ = fVar198 * local_980._0_4_;
      auVar33._8_4_ = fVar212 * local_980._8_4_;
      auVar33._12_4_ = fVar213 * local_980._12_4_;
      auVar33._16_4_ = fVar214 * local_980._16_4_;
      auVar33._20_4_ = fVar215 * local_980._20_4_;
      auVar33._24_4_ = fVar216 * local_980._24_4_;
      auVar33._28_4_ = auVar167._28_4_;
      auVar96 = vfmadd213ps_fma(auVar9,local_6c0,auVar33);
      auVar202 = vfmadd213ps_fma(auVar229,local_a60,ZEXT1632(auVar96));
      auVar34._4_4_ = fVar246 * local_980._4_4_;
      auVar34._0_4_ = fVar240 * local_980._0_4_;
      auVar34._8_4_ = fVar247 * local_980._8_4_;
      auVar34._12_4_ = fVar248 * local_980._12_4_;
      auVar34._16_4_ = fVar249 * local_980._16_4_;
      auVar34._20_4_ = fVar250 * local_980._20_4_;
      auVar34._24_4_ = fVar251 * local_980._24_4_;
      auVar34._28_4_ = 0;
      auVar96 = vfmadd231ps_fma(auVar34,_local_8e0,local_6c0);
      auVar256 = vfmadd231ps_fma(ZEXT1632(auVar96),_local_b40,local_a60);
      auVar66._4_4_ = uStack_79c;
      auVar66._0_4_ = local_7a0;
      auVar66._8_4_ = uStack_798;
      auVar66._12_4_ = uStack_794;
      auVar66._16_4_ = uStack_790;
      auVar66._20_4_ = uStack_78c;
      auVar66._24_4_ = uStack_788;
      auVar66._28_4_ = uStack_784;
      auVar8 = vandps_avx(auVar66,ZEXT1632(auVar256));
      auVar208._8_4_ = 0x219392ef;
      auVar208._0_8_ = 0x219392ef219392ef;
      auVar208._12_4_ = 0x219392ef;
      auVar208._16_4_ = 0x219392ef;
      auVar208._20_4_ = 0x219392ef;
      auVar208._24_4_ = 0x219392ef;
      auVar208._28_4_ = 0x219392ef;
      auVar167 = vcmpps_avx(auVar8,auVar208,1);
      auVar8 = vrcpps_avx(ZEXT1632(auVar256));
      auVar287._8_4_ = 0x3f800000;
      auVar287._0_8_ = &DAT_3f8000003f800000;
      auVar287._12_4_ = 0x3f800000;
      auVar287._16_4_ = 0x3f800000;
      auVar287._20_4_ = 0x3f800000;
      auVar287._24_4_ = 0x3f800000;
      auVar287._28_4_ = 0x3f800000;
      auVar229 = ZEXT1632(auVar256);
      auVar96 = vfnmadd213ps_fma(auVar8,auVar229,auVar287);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar8,auVar8);
      auVar192._0_8_ = auVar256._0_8_ ^ 0x8000000080000000;
      auVar192._8_4_ = auVar256._8_4_ ^ 0x80000000;
      auVar192._12_4_ = auVar256._12_4_ ^ 0x80000000;
      auVar192._16_4_ = 0x80000000;
      auVar192._20_4_ = 0x80000000;
      auVar192._24_4_ = 0x80000000;
      auVar192._28_4_ = 0x80000000;
      auVar244._0_4_ = auVar96._0_4_ * -auVar202._0_4_;
      auVar244._4_4_ = auVar96._4_4_ * -auVar202._4_4_;
      auVar244._8_4_ = auVar96._8_4_ * -auVar202._8_4_;
      auVar244._12_4_ = auVar96._12_4_ * -auVar202._12_4_;
      auVar244._16_4_ = 0x80000000;
      auVar244._20_4_ = 0x80000000;
      auVar244._24_4_ = 0x80000000;
      auVar244._28_4_ = 0;
      auVar8 = vcmpps_avx(auVar229,auVar192,1);
      auVar8 = vorps_avx(auVar167,auVar8);
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
      auVar8 = vblendvps_avx(auVar244,auVar276,auVar8);
      auVar71._4_4_ = fStack_2dc;
      auVar71._0_4_ = local_2e0;
      auVar71._8_4_ = fStack_2d8;
      auVar71._12_4_ = fStack_2d4;
      auVar71._16_4_ = fStack_2d0;
      auVar71._20_4_ = fStack_2cc;
      auVar71._24_4_ = fStack_2c8;
      auVar71._28_4_ = fStack_2c4;
      auVar9 = vmaxps_avx(auVar71,local_aa0);
      auVar9 = vmaxps_avx(auVar9,auVar8);
      auVar8 = vcmpps_avx(auVar229,auVar192,6);
      auVar8 = vorps_avx(auVar167,auVar8);
      auVar230._8_4_ = 0x7f800000;
      auVar230._0_8_ = 0x7f8000007f800000;
      auVar230._12_4_ = 0x7f800000;
      auVar230._16_4_ = 0x7f800000;
      auVar230._20_4_ = 0x7f800000;
      auVar230._24_4_ = 0x7f800000;
      auVar230._28_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar244,auVar230,auVar8);
      auVar229 = vminps_avx(auVar11,auVar8);
      auVar8 = vsubps_avx(ZEXT832(0) << 0x20,local_860._0_32_);
      auVar167 = vsubps_avx(ZEXT832(0) << 0x20,_local_880);
      auVar35._4_4_ = auVar167._4_4_ * fVar86;
      auVar35._0_4_ = auVar167._0_4_ * fVar85;
      auVar35._8_4_ = auVar167._8_4_ * fVar261;
      auVar35._12_4_ = auVar167._12_4_ * fVar262;
      auVar35._16_4_ = auVar167._16_4_ * fVar290;
      auVar35._20_4_ = auVar167._20_4_ * fVar291;
      auVar35._24_4_ = auVar167._24_4_ * fVar292;
      auVar35._28_4_ = auVar167._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar35,local_8a0,auVar8);
      auVar8 = vsubps_avx(ZEXT832(0) << 0x20,auVar193);
      auVar202 = vfnmadd231ps_fma(ZEXT1632(auVar96),local_b20,auVar8);
      auVar36._4_4_ = fVar246 * fVar86;
      auVar36._0_4_ = fVar240 * fVar85;
      auVar36._8_4_ = fVar247 * fVar261;
      auVar36._12_4_ = fVar248 * fVar262;
      auVar36._16_4_ = fVar249 * fVar290;
      auVar36._20_4_ = fVar250 * fVar291;
      auVar36._24_4_ = fVar251 * fVar292;
      auVar36._28_4_ = auVar8._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar36,_local_8e0,local_8a0);
      auVar256 = vfnmadd231ps_fma(ZEXT1632(auVar96),_local_b40,local_b20);
      auVar8 = vandps_avx(auVar66,ZEXT1632(auVar256));
      auVar11 = vrcpps_avx(ZEXT1632(auVar256));
      auVar108._8_4_ = 0x219392ef;
      auVar108._0_8_ = 0x219392ef219392ef;
      auVar108._12_4_ = 0x219392ef;
      auVar108._16_4_ = 0x219392ef;
      auVar108._20_4_ = 0x219392ef;
      auVar108._24_4_ = 0x219392ef;
      auVar108._28_4_ = 0x219392ef;
      auVar167 = vcmpps_avx(auVar8,auVar108,1);
      auVar193 = ZEXT1632(auVar256);
      auVar96 = vfnmadd213ps_fma(auVar11,auVar193,auVar287);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar11,auVar11);
      auVar245._0_8_ = auVar256._0_8_ ^ 0x8000000080000000;
      auVar245._8_4_ = auVar256._8_4_ ^ 0x80000000;
      auVar245._12_4_ = auVar256._12_4_ ^ 0x80000000;
      auVar245._16_4_ = 0x80000000;
      auVar245._20_4_ = 0x80000000;
      auVar245._24_4_ = 0x80000000;
      auVar245._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar96._4_4_ * -auVar202._4_4_;
      auVar37._0_4_ = auVar96._0_4_ * -auVar202._0_4_;
      auVar37._8_4_ = auVar96._8_4_ * -auVar202._8_4_;
      auVar37._12_4_ = auVar96._12_4_ * -auVar202._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar8 = vcmpps_avx(auVar193,auVar245,1);
      auVar8 = vorps_avx(auVar8,auVar167);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar109._16_4_ = 0xff800000;
      auVar109._20_4_ = 0xff800000;
      auVar109._24_4_ = 0xff800000;
      auVar109._28_4_ = 0xff800000;
      auVar8 = vblendvps_avx(auVar37,auVar109,auVar8);
      _local_560 = vmaxps_avx(auVar9,auVar8);
      auVar8 = vcmpps_avx(auVar193,auVar245,6);
      auVar8 = vorps_avx(auVar167,auVar8);
      auVar110._8_4_ = 0x7f800000;
      auVar110._0_8_ = 0x7f8000007f800000;
      auVar110._12_4_ = 0x7f800000;
      auVar110._16_4_ = 0x7f800000;
      auVar110._20_4_ = 0x7f800000;
      auVar110._24_4_ = 0x7f800000;
      auVar110._28_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar37,auVar110,auVar8);
      auVar111 = vandps_avx(local_260,auVar111);
      local_340 = vminps_avx(auVar229,auVar8);
      auVar8 = vcmpps_avx(_local_560,local_340,2);
      auVar167 = auVar111 & auVar8;
      if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar167 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar167 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar167 >> 0x7f,0) == '\0') &&
            (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar167 >> 0xbf,0) == '\0') &&
          (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar167[0x1f]) {
        auVar259 = ZEXT3264(local_900);
        auVar271 = ZEXT3264(local_a20);
        auVar278 = ZEXT3264(local_a40);
        auVar266 = ZEXT3264(local_b00);
        auVar239 = ZEXT3264(local_a80);
      }
      else {
        auVar167 = vminps_avx(local_460,auVar287);
        auVar53 = ZEXT812(0);
        auVar206 = ZEXT1228(auVar53) << 0x20;
        auVar167 = vmaxps_avx(auVar167,ZEXT1232(auVar53) << 0x20);
        auVar9 = vminps_avx(local_480,auVar287);
        auVar9 = vmaxps_avx(auVar9,ZEXT1232(auVar53) << 0x20);
        auVar38._4_4_ = (auVar167._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar167._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar167._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar167._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar167._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar167._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar167._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar167._28_4_ + 7.0;
        auVar96 = vfmadd213ps_fma(auVar38,auVar100,local_720);
        auVar39._4_4_ = (auVar9._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar9._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar9._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar9._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar9._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar9._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar9._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar9._28_4_ + 7.0;
        auVar202 = vfmadd213ps_fma(auVar39,auVar100,local_720);
        auVar167 = vminps_avx(local_760,auVar207);
        auVar9 = vminps_avx(auVar12,auVar13);
        auVar167 = vminps_avx(auVar167,auVar9);
        auVar103 = vsubps_avx(auVar167,auVar103);
        auVar111 = vandps_avx(auVar8,auVar111);
        local_460 = ZEXT1632(auVar96);
        local_480 = ZEXT1632(auVar202);
        auVar40._4_4_ = auVar103._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar103._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar103._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar103._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar103._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar103._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar103._24_4_ * 0.99999976;
        auVar40._28_4_ = 0x3f7ffffc;
        auVar8 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar41._4_4_ = auVar8._4_4_ * auVar8._4_4_;
        auVar41._0_4_ = auVar8._0_4_ * auVar8._0_4_;
        auVar41._8_4_ = auVar8._8_4_ * auVar8._8_4_;
        auVar41._12_4_ = auVar8._12_4_ * auVar8._12_4_;
        auVar41._16_4_ = auVar8._16_4_ * auVar8._16_4_;
        auVar41._20_4_ = auVar8._20_4_ * auVar8._20_4_;
        auVar41._24_4_ = auVar8._24_4_ * auVar8._24_4_;
        auVar41._28_4_ = auVar8._28_4_;
        auVar103 = vsubps_avx(auVar10,auVar41);
        auVar42._4_4_ = auVar103._4_4_ * fVar155 * 4.0;
        auVar42._0_4_ = auVar103._0_4_ * fVar153 * 4.0;
        auVar42._8_4_ = auVar103._8_4_ * fVar172 * 4.0;
        auVar42._12_4_ = auVar103._12_4_ * fVar173 * 4.0;
        auVar42._16_4_ = auVar103._16_4_ * fVar174 * 4.0;
        auVar42._20_4_ = auVar103._20_4_ * fVar175 * 4.0;
        auVar42._24_4_ = auVar103._24_4_ * fVar234 * 4.0;
        auVar42._28_4_ = auVar8._28_4_;
        auVar8 = vsubps_avx(auVar28,auVar42);
        local_9c0 = vcmpps_avx(auVar8,ZEXT1232(auVar53) << 0x20,5);
        if ((((((((local_9c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_9c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_9c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_9c0 >> 0x7f,0) == '\0') &&
              (local_9c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_9c0 >> 0xbf,0) == '\0') &&
            (local_9c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_9c0[0x1f]) {
          auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
          local_7e0 = ZEXT832(0) << 0x20;
          _local_800 = ZEXT832(0) << 0x20;
          auVar194 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          _local_7c0 = local_7e0;
        }
        else {
          auVar166._0_4_ = fVar153 + fVar153;
          auVar166._4_4_ = fVar155 + fVar155;
          auVar166._8_4_ = fVar172 + fVar172;
          auVar166._12_4_ = fVar173 + fVar173;
          auVar166._16_4_ = fVar174 + fVar174;
          auVar166._20_4_ = fVar175 + fVar175;
          auVar166._24_4_ = fVar234 + fVar234;
          auVar166._28_4_ = fVar119 + fVar119;
          auVar167 = vrcpps_avx(auVar166);
          auVar96 = vfnmadd213ps_fma(auVar166,auVar167,auVar287);
          auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar167,auVar167);
          auVar167 = vsqrtps_avx(auVar8);
          auVar209._0_8_ = local_240._0_8_ ^ 0x8000000080000000;
          auVar209._8_4_ = -local_240._8_4_;
          auVar209._12_4_ = -local_240._12_4_;
          auVar209._16_4_ = -local_240._16_4_;
          auVar209._20_4_ = -local_240._20_4_;
          auVar209._24_4_ = -local_240._24_4_;
          auVar209._28_4_ = -local_240._28_4_;
          auVar9 = vsubps_avx(auVar209,auVar167);
          auVar167 = vsubps_avx(auVar167,local_240);
          fVar172 = auVar9._0_4_ * auVar96._0_4_;
          fVar290 = auVar9._4_4_ * auVar96._4_4_;
          auVar43._4_4_ = fVar290;
          auVar43._0_4_ = fVar172;
          fVar291 = auVar9._8_4_ * auVar96._8_4_;
          auVar43._8_4_ = fVar291;
          fVar292 = auVar9._12_4_ * auVar96._12_4_;
          auVar43._12_4_ = fVar292;
          fVar173 = auVar9._16_4_ * 0.0;
          auVar43._16_4_ = fVar173;
          fVar174 = auVar9._20_4_ * 0.0;
          auVar43._20_4_ = fVar174;
          fVar175 = auVar9._24_4_ * 0.0;
          auVar43._24_4_ = fVar175;
          auVar43._28_4_ = local_260._28_4_;
          fVar119 = auVar167._0_4_ * auVar96._0_4_;
          fVar85 = auVar167._4_4_ * auVar96._4_4_;
          auVar44._4_4_ = fVar85;
          auVar44._0_4_ = fVar119;
          fVar86 = auVar167._8_4_ * auVar96._8_4_;
          auVar44._8_4_ = fVar86;
          fVar153 = auVar167._12_4_ * auVar96._12_4_;
          auVar44._12_4_ = fVar153;
          fVar261 = auVar167._16_4_ * 0.0;
          auVar44._16_4_ = fVar261;
          fVar155 = auVar167._20_4_ * 0.0;
          auVar44._20_4_ = fVar155;
          fVar262 = auVar167._24_4_ * 0.0;
          auVar44._24_4_ = fVar262;
          auVar44._28_4_ = 0x80000000;
          auVar96 = vfmadd213ps_fma(local_6e0,auVar43,local_700);
          auVar202 = vfmadd213ps_fma(local_6e0,auVar44,local_700);
          auVar45._28_4_ = auVar9._28_4_;
          auVar45._0_28_ =
               ZEXT1628(CONCAT412(fVar156 * auVar96._12_4_,
                                  CONCAT48(fVar154 * auVar96._8_4_,
                                           CONCAT44(fVar157 * auVar96._4_4_,fVar152 * auVar96._0_4_)
                                          )));
          auVar167 = ZEXT1632(CONCAT412(auVar202._12_4_ * fVar156,
                                        CONCAT48(auVar202._8_4_ * fVar154,
                                                 CONCAT44(auVar202._4_4_ * fVar157,
                                                          auVar202._0_4_ * fVar152))));
          auVar96 = vfmadd213ps_fma(auVar269,auVar45,auVar190);
          auVar202 = vfmadd213ps_fma(auVar269,auVar167,auVar190);
          auVar256 = vfmadd213ps_fma(auVar194,auVar45,auVar101);
          auVar4 = vfmadd213ps_fma(auVar194,auVar167,auVar101);
          auVar129 = vfmadd213ps_fma(auVar45,auVar165,auVar288);
          auVar5 = vfmadd213ps_fma(auVar165,auVar167,auVar288);
          auVar46._4_4_ = fVar290 * (float)local_b40._4_4_;
          auVar46._0_4_ = fVar172 * (float)local_b40._0_4_;
          auVar46._8_4_ = fVar291 * fStack_b38;
          auVar46._12_4_ = fVar292 * fStack_b34;
          auVar46._16_4_ = fVar173 * fStack_b30;
          auVar46._20_4_ = fVar174 * fStack_b2c;
          auVar46._24_4_ = fVar175 * fStack_b28;
          auVar46._28_4_ = 0;
          auVar165 = vsubps_avx(auVar46,ZEXT1632(auVar96));
          auVar195._0_4_ = fVar172 * (float)local_8e0._0_4_;
          auVar195._4_4_ = fVar290 * (float)local_8e0._4_4_;
          auVar195._8_4_ = fVar291 * fStack_8d8;
          auVar195._12_4_ = fVar292 * fStack_8d4;
          auVar195._16_4_ = fVar173 * fStack_8d0;
          auVar195._20_4_ = fVar174 * fStack_8cc;
          auVar195._24_4_ = fVar175 * fStack_8c8;
          auVar195._28_4_ = 0;
          auVar194 = vsubps_avx(auVar195,ZEXT1632(auVar256));
          auVar232._0_4_ = fVar240 * fVar172;
          auVar232._4_4_ = fVar246 * fVar290;
          auVar232._8_4_ = fVar247 * fVar291;
          auVar232._12_4_ = fVar248 * fVar292;
          auVar232._16_4_ = fVar249 * fVar173;
          auVar232._20_4_ = fVar250 * fVar174;
          auVar232._24_4_ = fVar251 * fVar175;
          auVar232._28_4_ = 0;
          auVar269 = vsubps_avx(auVar232,ZEXT1632(auVar129));
          auVar206 = auVar269._0_28_;
          auVar47._4_4_ = fVar85 * (float)local_b40._4_4_;
          auVar47._0_4_ = fVar119 * (float)local_b40._0_4_;
          auVar47._8_4_ = fVar86 * fStack_b38;
          auVar47._12_4_ = fVar153 * fStack_b34;
          auVar47._16_4_ = fVar261 * fStack_b30;
          auVar47._20_4_ = fVar155 * fStack_b2c;
          auVar47._24_4_ = fVar262 * fStack_b28;
          auVar47._28_4_ = 0;
          _local_7c0 = vsubps_avx(auVar47,ZEXT1632(auVar202));
          auVar48._4_4_ = fVar85 * (float)local_8e0._4_4_;
          auVar48._0_4_ = fVar119 * (float)local_8e0._0_4_;
          auVar48._8_4_ = fVar86 * fStack_8d8;
          auVar48._12_4_ = fVar153 * fStack_8d4;
          auVar48._16_4_ = fVar261 * fStack_8d0;
          auVar48._20_4_ = fVar155 * fStack_8cc;
          auVar48._24_4_ = fVar262 * fStack_8c8;
          auVar48._28_4_ = local_7c0._28_4_;
          local_7e0 = vsubps_avx(auVar48,ZEXT1632(auVar4));
          auVar49._4_4_ = fVar246 * fVar85;
          auVar49._0_4_ = fVar240 * fVar119;
          auVar49._8_4_ = fVar247 * fVar86;
          auVar49._12_4_ = fVar248 * fVar153;
          auVar49._16_4_ = fVar249 * fVar261;
          auVar49._20_4_ = fVar250 * fVar155;
          auVar49._24_4_ = fVar251 * fVar262;
          auVar49._28_4_ = local_7e0._28_4_;
          _local_800 = vsubps_avx(auVar49,ZEXT1632(auVar5));
          auVar269 = vcmpps_avx(auVar8,_DAT_02020f00,5);
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar231 = vblendvps_avx(auVar233,auVar43,auVar269);
          auVar67._4_4_ = uStack_79c;
          auVar67._0_4_ = local_7a0;
          auVar67._8_4_ = uStack_798;
          auVar67._12_4_ = uStack_794;
          auVar67._16_4_ = uStack_790;
          auVar67._20_4_ = uStack_78c;
          auVar67._24_4_ = uStack_788;
          auVar67._28_4_ = uStack_784;
          auVar8 = vandps_avx(auVar67,local_300);
          auVar8 = vmaxps_avx(local_420,auVar8);
          auVar50._4_4_ = auVar8._4_4_ * 1.9073486e-06;
          auVar50._0_4_ = auVar8._0_4_ * 1.9073486e-06;
          auVar50._8_4_ = auVar8._8_4_ * 1.9073486e-06;
          auVar50._12_4_ = auVar8._12_4_ * 1.9073486e-06;
          auVar50._16_4_ = auVar8._16_4_ * 1.9073486e-06;
          auVar50._20_4_ = auVar8._20_4_ * 1.9073486e-06;
          auVar50._24_4_ = auVar8._24_4_ * 1.9073486e-06;
          auVar50._28_4_ = auVar8._28_4_;
          auVar8 = vandps_avx(auVar67,auVar277);
          auVar8 = vcmpps_avx(auVar8,auVar50,1);
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
          auVar237 = vblendvps_avx(auVar238,auVar44,auVar269);
          auVar277 = auVar269 & auVar8;
          if ((((((((auVar277 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar277 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar277 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar277 >> 0x7f,0) != '\0') ||
                (auVar277 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar277 >> 0xbf,0) != '\0') ||
              (auVar277 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar277[0x1f] < '\0') {
            auVar8 = vandps_avx(auVar8,auVar269);
            auVar277 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
            auVar281._8_4_ = 0xff800000;
            auVar281._0_8_ = 0xff800000ff800000;
            auVar281._12_4_ = 0xff800000;
            auVar281._16_4_ = 0xff800000;
            auVar281._20_4_ = 0xff800000;
            auVar281._24_4_ = 0xff800000;
            auVar281._28_4_ = 0xff800000;
            auVar282._8_4_ = 0x7f800000;
            auVar282._0_8_ = 0x7f8000007f800000;
            auVar282._12_4_ = 0x7f800000;
            auVar282._16_4_ = 0x7f800000;
            auVar282._20_4_ = 0x7f800000;
            auVar282._24_4_ = 0x7f800000;
            auVar282._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar282,auVar281,auVar277);
            auVar96 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
            auVar167 = vpmovsxwd_avx2(auVar96);
            auVar231 = vblendvps_avx(auVar231,auVar103,auVar167);
            auVar103 = vblendvps_avx(auVar281,auVar282,auVar277);
            auVar237 = vblendvps_avx(auVar237,auVar103,auVar167);
            auVar258._0_8_ = auVar8._0_8_ ^ 0xffffffffffffffff;
            auVar258._8_4_ = auVar8._8_4_ ^ 0xffffffff;
            auVar258._12_4_ = auVar8._12_4_ ^ 0xffffffff;
            auVar258._16_4_ = auVar8._16_4_ ^ 0xffffffff;
            auVar258._20_4_ = auVar8._20_4_ ^ 0xffffffff;
            auVar258._24_4_ = auVar8._24_4_ ^ 0xffffffff;
            auVar258._28_4_ = auVar8._28_4_ ^ 0xffffffff;
            auVar8 = vorps_avx(auVar277,auVar258);
            local_9c0 = vandps_avx(auVar8,auVar269);
          }
        }
        auVar266 = ZEXT3264(local_b00);
        local_3a0 = _local_560;
        local_380 = vminps_avx(local_340,auVar231);
        _local_4e0 = vmaxps_avx(_local_560,auVar237);
        _local_360 = _local_4e0;
        auVar8 = vcmpps_avx(_local_560,local_380,2);
        local_4a0 = vandps_avx(auVar8,auVar111);
        auVar8 = vcmpps_avx(_local_4e0,local_340,2);
        local_5a0 = vandps_avx(auVar8,auVar111);
        auVar111 = vorps_avx(local_5a0,local_4a0);
        auVar242 = local_9a0._0_28_;
        auVar271 = ZEXT3264(local_a20);
        auVar278 = ZEXT3264(local_a40);
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0x7f,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar111 >> 0xbf,0) == '\0') &&
            (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar111[0x1f]) {
          auVar259 = ZEXT3264(local_900);
          auVar239 = ZEXT3264(local_a80);
        }
        else {
          local_520._0_8_ = local_9c0._0_8_ ^ 0xffffffffffffffff;
          local_520._8_4_ = local_9c0._8_4_ ^ 0xffffffff;
          local_520._12_4_ = local_9c0._12_4_ ^ 0xffffffff;
          local_520._16_4_ = local_9c0._16_4_ ^ 0xffffffff;
          local_520._20_4_ = local_9c0._20_4_ ^ 0xffffffff;
          local_520._24_4_ = local_9c0._24_4_ ^ 0xffffffff;
          local_520._28_4_ = local_9c0._28_4_ ^ 0xffffffff;
          auVar51._4_4_ = fVar246 * auVar206._4_4_;
          auVar51._0_4_ = fVar240 * auVar206._0_4_;
          auVar51._8_4_ = fVar247 * auVar206._8_4_;
          auVar51._12_4_ = fVar248 * auVar206._12_4_;
          auVar51._16_4_ = fVar249 * auVar206._16_4_;
          auVar51._20_4_ = fVar250 * auVar206._20_4_;
          auVar51._24_4_ = fVar251 * auVar206._24_4_;
          auVar51._28_4_ = local_9c0._28_4_;
          auVar96 = vfmadd213ps_fma(auVar194,_local_8e0,auVar51);
          auVar96 = vfmadd213ps_fma(auVar165,_local_b40,ZEXT1632(auVar96));
          auVar68._4_4_ = uStack_79c;
          auVar68._0_4_ = local_7a0;
          auVar68._8_4_ = uStack_798;
          auVar68._12_4_ = uStack_794;
          auVar68._16_4_ = uStack_790;
          auVar68._20_4_ = uStack_78c;
          auVar68._24_4_ = uStack_788;
          auVar68._28_4_ = uStack_784;
          auVar111 = vandps_avx(ZEXT1632(auVar96),auVar68);
          auVar143._8_4_ = 0x3e99999a;
          auVar143._0_8_ = 0x3e99999a3e99999a;
          auVar143._12_4_ = 0x3e99999a;
          auVar143._16_4_ = 0x3e99999a;
          auVar143._20_4_ = 0x3e99999a;
          auVar143._24_4_ = 0x3e99999a;
          auVar143._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar143,1);
          auVar111 = vorps_avx(auVar111,local_520);
          auVar144._8_4_ = 3;
          auVar144._0_8_ = 0x300000003;
          auVar144._12_4_ = 3;
          auVar144._16_4_ = 3;
          auVar144._20_4_ = 3;
          auVar144._24_4_ = 3;
          auVar144._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar168,auVar144,auVar111);
          uVar81 = (undefined4)local_5e0;
          local_540._4_4_ = uVar81;
          local_540._0_4_ = uVar81;
          local_540._8_4_ = uVar81;
          local_540._12_4_ = uVar81;
          local_540._16_4_ = uVar81;
          local_540._20_4_ = uVar81;
          local_540._24_4_ = uVar81;
          local_540._28_4_ = uVar81;
          local_4c0 = vpcmpgtd_avx2(auVar111,local_540);
          local_580 = vpandn_avx2(local_4c0,local_4a0);
          auVar239 = ZEXT3264(local_580);
          auVar111 = local_4a0 & ~local_4c0;
          auStack_5d8 = auVar207._8_24_;
          uVar82 = local_5e0;
          local_500 = local_5a0;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            auVar202 = vminps_avx(local_ab0,local_ad0);
            auVar96 = vmaxps_avx(local_ab0,local_ad0);
            auVar256 = vminps_avx(local_ac0,_local_ae0);
            auVar4 = vminps_avx(auVar202,auVar256);
            auVar202 = vmaxps_avx(local_ac0,_local_ae0);
            auVar256 = vmaxps_avx(auVar96,auVar202);
            auVar96 = vandps_avx(auVar4,local_920);
            auVar202 = vandps_avx(auVar256,local_920);
            auVar96 = vmaxps_avx(auVar96,auVar202);
            auVar202 = vmovshdup_avx(auVar96);
            auVar202 = vmaxss_avx(auVar202,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar202);
            local_860._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_740 = vshufps_avx(auVar256,auVar256,0xff);
            local_780._4_4_ = (float)local_560._4_4_ + (float)local_8c0._4_4_;
            local_780._0_4_ = (float)local_560._0_4_ + (float)local_8c0._0_4_;
            fStack_778 = fStack_558 + fStack_8b8;
            fStack_774 = fStack_554 + fStack_8b4;
            fStack_770 = fStack_550 + fStack_8b0;
            fStack_76c = fStack_54c + fStack_8ac;
            fStack_768 = fStack_548 + fStack_8a8;
            fStack_764 = fStack_544 + fStack_8a4;
            do {
              auVar145._8_4_ = 0x7f800000;
              auVar145._0_8_ = 0x7f8000007f800000;
              auVar145._12_4_ = 0x7f800000;
              auVar145._16_4_ = 0x7f800000;
              auVar145._20_4_ = 0x7f800000;
              auVar145._24_4_ = 0x7f800000;
              auVar145._28_4_ = 0x7f800000;
              auVar111 = auVar239._0_32_;
              auVar8 = vblendvps_avx(auVar145,_local_560,auVar111);
              auVar103 = vshufps_avx(auVar8,auVar8,0xb1);
              auVar103 = vminps_avx(auVar8,auVar103);
              auVar277 = vshufpd_avx(auVar103,auVar103,5);
              auVar103 = vminps_avx(auVar103,auVar277);
              auVar277 = vpermpd_avx2(auVar103,0x4e);
              auVar103 = vminps_avx(auVar103,auVar277);
              auVar8 = vcmpps_avx(auVar8,auVar103,0);
              auVar103 = auVar111 & auVar8;
              if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar103 >> 0x7f,0) != '\0') ||
                    (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar103 >> 0xbf,0) != '\0') ||
                  (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar103[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar8,auVar111);
              }
              local_760._0_8_ = uVar83;
              uVar76 = vmovmskps_avx(auVar111);
              iVar14 = 0;
              for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar77 = iVar14 << 2;
              *(undefined4 *)(local_580 + uVar77) = 0;
              uVar76 = *(uint *)(local_460 + uVar77);
              fVar119 = *(float *)(local_3a0 + uVar77);
              fVar85 = local_b44;
              if ((float)local_930._0_4_ < 0.0) {
                fVar85 = sqrtf((float)local_930._0_4_);
              }
              auVar239 = ZEXT464(uVar76);
              local_aa0._0_4_ = fVar85 * 1.9073486e-06;
              lVar79 = 5;
              do {
                fVar152 = auVar239._0_4_;
                fVar85 = 1.0 - fVar152;
                auVar123._0_4_ = local_ad0._0_4_ * fVar152;
                auVar123._4_4_ = local_ad0._4_4_ * fVar152;
                auVar123._8_4_ = local_ad0._8_4_ * fVar152;
                auVar123._12_4_ = local_ad0._12_4_ * fVar152;
                auVar159._4_4_ = fVar85;
                auVar159._0_4_ = fVar85;
                auVar159._8_4_ = fVar85;
                auVar159._12_4_ = fVar85;
                auVar96 = vfmadd231ps_fma(auVar123,auVar159,local_ab0);
                auVar177._0_4_ = local_ac0._0_4_ * fVar152;
                auVar177._4_4_ = local_ac0._4_4_ * fVar152;
                auVar177._8_4_ = local_ac0._8_4_ * fVar152;
                auVar177._12_4_ = local_ac0._12_4_ * fVar152;
                auVar202 = vfmadd231ps_fma(auVar177,auVar159,local_ad0);
                auVar222._0_4_ = fVar152 * auVar202._0_4_;
                auVar222._4_4_ = fVar152 * auVar202._4_4_;
                auVar222._8_4_ = fVar152 * auVar202._8_4_;
                auVar222._12_4_ = fVar152 * auVar202._12_4_;
                local_a60._0_16_ = vfmadd231ps_fma(auVar222,auVar159,auVar96);
                auVar124._0_4_ = fVar152 * (float)local_ae0._0_4_;
                auVar124._4_4_ = fVar152 * (float)local_ae0._4_4_;
                auVar124._8_4_ = fVar152 * fStack_ad8;
                auVar124._12_4_ = fVar152 * fStack_ad4;
                auVar96 = vfmadd231ps_fma(auVar124,auVar159,local_ac0);
                auVar201._0_4_ = fVar152 * auVar96._0_4_;
                auVar201._4_4_ = fVar152 * auVar96._4_4_;
                auVar201._8_4_ = fVar152 * auVar96._8_4_;
                auVar201._12_4_ = fVar152 * auVar96._12_4_;
                auVar202 = vfmadd231ps_fma(auVar201,auVar159,auVar202);
                auVar125._4_4_ = fVar119;
                auVar125._0_4_ = fVar119;
                auVar125._8_4_ = fVar119;
                auVar125._12_4_ = fVar119;
                auVar96 = vfmadd213ps_fma(auVar125,local_910,_DAT_01feba10);
                auVar92._0_4_ = fVar152 * auVar202._0_4_;
                auVar92._4_4_ = fVar152 * auVar202._4_4_;
                auVar92._8_4_ = fVar152 * auVar202._8_4_;
                auVar92._12_4_ = fVar152 * auVar202._12_4_;
                auVar256 = vfmadd231ps_fma(auVar92,local_a60._0_16_,auVar159);
                local_6c0._0_16_ = auVar256;
                auVar96 = vsubps_avx(auVar96,auVar256);
                _local_880 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_9c0._0_16_ = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  local_b20._0_16_ = auVar202;
                  auVar259._0_4_ = sqrtf(auVar96._0_4_);
                  auVar259._4_60_ = extraout_var;
                  auVar96 = auVar259._0_16_;
                  auVar202 = local_b20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                }
                auVar202 = vsubps_avx(auVar202,local_a60._0_16_);
                local_a60._0_4_ = auVar202._0_4_ * 3.0;
                local_a60._4_4_ = auVar202._4_4_ * 3.0;
                local_a60._8_4_ = auVar202._8_4_ * 3.0;
                local_a60._12_4_ = auVar202._12_4_ * 3.0;
                auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar85),
                                           auVar239._0_16_);
                auVar256 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar239._0_16_,
                                           ZEXT416((uint)fVar85));
                fVar85 = fVar85 * 6.0;
                fVar86 = auVar202._0_4_ * 6.0;
                fVar157 = auVar256._0_4_ * 6.0;
                fVar153 = fVar152 * 6.0;
                auVar178._0_4_ = fVar153 * (float)local_ae0._0_4_;
                auVar178._4_4_ = fVar153 * (float)local_ae0._4_4_;
                auVar178._8_4_ = fVar153 * fStack_ad8;
                auVar178._12_4_ = fVar153 * fStack_ad4;
                auVar126._4_4_ = fVar157;
                auVar126._0_4_ = fVar157;
                auVar126._8_4_ = fVar157;
                auVar126._12_4_ = fVar157;
                auVar202 = vfmadd132ps_fma(auVar126,auVar178,local_ac0);
                auVar179._4_4_ = fVar86;
                auVar179._0_4_ = fVar86;
                auVar179._8_4_ = fVar86;
                auVar179._12_4_ = fVar86;
                auVar202 = vfmadd132ps_fma(auVar179,auVar202,local_ad0);
                auVar256 = vdpps_avx(local_a60._0_16_,local_a60._0_16_,0x7f);
                auVar127._4_4_ = fVar85;
                auVar127._0_4_ = fVar85;
                auVar127._8_4_ = fVar85;
                auVar127._12_4_ = fVar85;
                auVar129 = vfmadd132ps_fma(auVar127,auVar202,local_ab0);
                auVar202 = vblendps_avx(auVar256,_DAT_01feba10,0xe);
                auVar4 = vrsqrtss_avx(auVar202,auVar202);
                fVar157 = auVar256._0_4_;
                fVar85 = auVar4._0_4_;
                auVar4 = vdpps_avx(local_a60._0_16_,auVar129,0x7f);
                fVar85 = fVar85 * 1.5 + fVar157 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar128._0_4_ = auVar129._0_4_ * fVar157;
                auVar128._4_4_ = auVar129._4_4_ * fVar157;
                auVar128._8_4_ = auVar129._8_4_ * fVar157;
                auVar128._12_4_ = auVar129._12_4_ * fVar157;
                fVar86 = auVar4._0_4_;
                auVar223._0_4_ = local_a60._0_4_ * fVar86;
                auVar223._4_4_ = local_a60._4_4_ * fVar86;
                auVar223._8_4_ = local_a60._8_4_ * fVar86;
                auVar223._12_4_ = local_a60._12_4_ * fVar86;
                auVar4 = vsubps_avx(auVar128,auVar223);
                auVar202 = vrcpss_avx(auVar202,auVar202);
                auVar129 = vfnmadd213ss_fma(auVar202,auVar256,ZEXT416(0x40000000));
                fVar86 = auVar202._0_4_ * auVar129._0_4_;
                auVar202 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                      ZEXT416((uint)(fVar119 * (float)local_aa0._0_4_)));
                uVar83 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
                auVar255._0_8_ = uVar83 ^ 0x8000000080000000;
                auVar255._8_4_ = -local_a60._8_4_;
                auVar255._12_4_ = -local_a60._12_4_;
                local_8a0._0_4_ = fVar85 * auVar4._0_4_ * fVar86;
                local_8a0._4_4_ = fVar85 * auVar4._4_4_ * fVar86;
                local_8a0._8_4_ = fVar85 * auVar4._8_4_ * fVar86;
                local_8a0._12_4_ = fVar85 * auVar4._12_4_ * fVar86;
                local_980._0_4_ = local_a60._0_4_ * fVar85;
                local_980._4_4_ = local_a60._4_4_ * fVar85;
                local_980._8_4_ = local_a60._8_4_ * fVar85;
                local_980._12_4_ = local_a60._12_4_ * fVar85;
                if (fVar157 < -fVar157) {
                  local_b20._0_4_ = auVar96._0_4_;
                  local_960._0_16_ = auVar255;
                  fVar85 = sqrtf(fVar157);
                  auVar96 = ZEXT416((uint)local_b20._0_4_);
                  auVar255 = local_960._0_16_;
                }
                else {
                  auVar256 = vsqrtss_avx(auVar256,auVar256);
                  fVar85 = auVar256._0_4_;
                }
                local_b20._0_16_ = vdpps_avx(_local_880,local_980._0_16_,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar96,
                                         ZEXT416((uint)auVar202._0_4_));
                auVar256 = vdpps_avx(auVar255,local_980._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_880,local_8a0._0_16_,0x7f);
                auVar129 = vdpps_avx(local_910,local_980._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_860._0_4_ / fVar85)),auVar5);
                local_960._0_4_ = auVar96._0_4_;
                auVar93._0_4_ = local_b20._0_4_ * local_b20._0_4_;
                auVar93._4_4_ = local_b20._4_4_ * local_b20._4_4_;
                auVar93._8_4_ = local_b20._8_4_ * local_b20._8_4_;
                auVar93._12_4_ = local_b20._12_4_ * local_b20._12_4_;
                auVar96 = vdpps_avx(_local_880,auVar255,0x7f);
                auVar91 = vsubps_avx(local_9c0._0_16_,auVar93);
                auVar5 = vrsqrtss_avx(auVar91,auVar91);
                fVar86 = auVar91._0_4_;
                fVar85 = auVar5._0_4_;
                fVar85 = fVar85 * 1.5 + fVar86 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar5 = vdpps_avx(_local_880,local_910,0x7f);
                local_980._0_16_ = ZEXT416((uint)(auVar256._0_4_ + auVar4._0_4_));
                local_8a0._0_16_ = vfnmadd231ss_fma(auVar96,local_b20._0_16_,local_980._0_16_);
                auVar96 = vfnmadd231ss_fma(auVar5,local_b20._0_16_,auVar129);
                if (fVar86 < 0.0) {
                  local_6e0._0_16_ = auVar129;
                  local_700._0_4_ = fVar85;
                  local_720._0_16_ = auVar96;
                  fVar86 = sqrtf(fVar86);
                  fVar85 = (float)local_700._0_4_;
                  auVar96 = local_720._0_16_;
                  auVar129 = local_6e0._0_16_;
                }
                else {
                  auVar256 = vsqrtss_avx(auVar91,auVar91);
                  fVar86 = auVar256._0_4_;
                }
                auVar256 = vpermilps_avx(local_6c0._0_16_,0xff);
                auVar5 = vpermilps_avx(local_a60._0_16_,0xff);
                auVar4 = vfmsub213ss_fma(local_8a0._0_16_,ZEXT416((uint)fVar85),auVar5);
                auVar180._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                auVar180._8_4_ = auVar129._8_4_ ^ 0x80000000;
                auVar180._12_4_ = auVar129._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * fVar85));
                auVar4 = vfmsub231ss_fma(ZEXT416((uint)(auVar129._0_4_ * auVar4._0_4_)),
                                         local_980._0_16_,auVar96);
                auVar96 = vinsertps_avx(auVar96,auVar180,0x10);
                uVar81 = auVar4._0_4_;
                auVar181._4_4_ = uVar81;
                auVar181._0_4_ = uVar81;
                auVar181._8_4_ = uVar81;
                auVar181._12_4_ = uVar81;
                auVar96 = vdivps_avx(auVar96,auVar181);
                auVar129 = ZEXT416((uint)(fVar86 - auVar256._0_4_));
                auVar4 = vinsertps_avx(local_b20._0_16_,auVar129,0x10);
                auVar160._0_4_ = auVar4._0_4_ * auVar96._0_4_;
                auVar160._4_4_ = auVar4._4_4_ * auVar96._4_4_;
                auVar160._8_4_ = auVar4._8_4_ * auVar96._8_4_;
                auVar160._12_4_ = auVar4._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar203,local_980._0_16_,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar181);
                auVar256 = vhaddps_avx(auVar160,auVar160);
                auVar182._0_4_ = auVar4._0_4_ * auVar96._0_4_;
                auVar182._4_4_ = auVar4._4_4_ * auVar96._4_4_;
                auVar182._8_4_ = auVar4._8_4_ * auVar96._8_4_;
                auVar182._12_4_ = auVar4._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar182,auVar182);
                fVar152 = fVar152 - auVar256._0_4_;
                auVar239 = ZEXT464((uint)fVar152);
                fVar119 = fVar119 - auVar96._0_4_;
                auVar96 = vandps_avx(local_b20._0_16_,local_920);
                bVar52 = true;
                auVar242 = local_9a0._0_28_;
                if ((float)local_960._0_4_ <= auVar96._0_4_) {
LAB_016e74c3:
                  auVar271 = ZEXT3264(local_a20);
                  auVar266 = ZEXT3264(local_b00);
                  auVar278 = ZEXT3264(local_a40);
                }
                else {
                  auVar202 = vfmadd231ss_fma(ZEXT416((uint)((float)local_960._0_4_ + auVar202._0_4_)
                                                    ),local_740,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar129,local_920);
                  if (auVar202._0_4_ <= auVar96._0_4_) goto LAB_016e74c3;
                  fVar119 = fVar119 + (float)local_830._0_4_;
                  if (fVar119 < fVar84) {
                    bVar52 = false;
                    unaff_BL = 0;
                    goto LAB_016e74c3;
                  }
                  fVar85 = *(float *)(ray + k * 4 + 0x80);
                  auVar266 = ZEXT3264(local_b00);
                  if (fVar85 < fVar119) {
                    bVar52 = false;
                    unaff_BL = 0;
                    goto LAB_016e74c3;
                  }
                  bVar52 = false;
                  if (fVar152 < 0.0) {
                    unaff_BL = 0;
                    goto LAB_016e74c3;
                  }
                  auVar271 = ZEXT3264(local_a20);
                  if (1.0 < fVar152) {
                    unaff_BL = 0;
                    bVar52 = false;
                    goto LAB_016e74c3;
                  }
                  auVar96 = vrsqrtss_avx(local_9c0._0_16_,local_9c0._0_16_);
                  fVar86 = auVar96._0_4_;
                  pGVar2 = (context->scene->geometries).items[local_b50].ptr;
                  auVar278 = ZEXT3264(local_a40);
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    unaff_BL = 0;
LAB_016e7591:
                    bVar52 = false;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_BL = 1;
                      goto LAB_016e7591;
                    }
                    fVar86 = fVar86 * 1.5 + local_9c0._0_4_ * -0.5 * fVar86 * fVar86 * fVar86;
                    auVar130._0_4_ = fVar86 * (float)local_880._0_4_;
                    auVar130._4_4_ = fVar86 * (float)local_880._4_4_;
                    auVar130._8_4_ = fVar86 * fStack_878;
                    auVar130._12_4_ = fVar86 * fStack_874;
                    auVar4 = vfmadd213ps_fma(auVar5,auVar130,local_a60._0_16_);
                    auVar96 = vshufps_avx(auVar130,auVar130,0xc9);
                    auVar202 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                    auVar131._0_4_ = auVar130._0_4_ * auVar202._0_4_;
                    auVar131._4_4_ = auVar130._4_4_ * auVar202._4_4_;
                    auVar131._8_4_ = auVar130._8_4_ * auVar202._8_4_;
                    auVar131._12_4_ = auVar130._12_4_ * auVar202._12_4_;
                    auVar256 = vfmsub231ps_fma(auVar131,local_a60._0_16_,auVar96);
                    auVar96 = vshufps_avx(auVar256,auVar256,0xc9);
                    auVar202 = vshufps_avx(auVar4,auVar4,0xc9);
                    auVar256 = vshufps_avx(auVar256,auVar256,0xd2);
                    auVar94._0_4_ = auVar4._0_4_ * auVar256._0_4_;
                    auVar94._4_4_ = auVar4._4_4_ * auVar256._4_4_;
                    auVar94._8_4_ = auVar4._8_4_ * auVar256._8_4_;
                    auVar94._12_4_ = auVar4._12_4_ * auVar256._12_4_;
                    auVar96 = vfmsub231ps_fma(auVar94,auVar96,auVar202);
                    local_680 = (RTCHitN  [16])vshufps_avx(auVar96,auVar96,0x55);
                    auStack_670 = vshufps_avx(auVar96,auVar96,0xaa);
                    local_660 = auVar96._0_4_;
                    local_640 = ZEXT416(0) << 0x20;
                    local_630 = CONCAT44(uStack_69c,local_6a0);
                    uStack_628 = CONCAT44(uStack_694,uStack_698);
                    local_620._4_4_ = uStack_68c;
                    local_620._0_4_ = local_690;
                    local_620._8_4_ = uStack_688;
                    local_620._12_4_ = uStack_684;
                    vpcmpeqd_avx2(ZEXT1632(local_620),ZEXT1632(local_620));
                    uStack_60c = context->user->instID[0];
                    local_610 = uStack_60c;
                    uStack_608 = uStack_60c;
                    uStack_604 = uStack_60c;
                    uStack_600 = context->user->instPrimID[0];
                    uStack_5fc = uStack_600;
                    uStack_5f8 = uStack_600;
                    uStack_5f4 = uStack_600;
                    *(float *)(ray + k * 4 + 0x80) = fVar119;
                    local_b60 = *local_9f8;
                    uStack_b58 = local_9f8[1];
                    local_9f0.valid = (int *)&local_b60;
                    local_9f0.geometryUserPtr = pGVar2->userPtr;
                    local_9f0.context = context->user;
                    local_9f0.hit = local_680;
                    local_9f0.N = 4;
                    local_9f0.ray = (RTCRayN *)ray;
                    uStack_65c = local_660;
                    uStack_658 = local_660;
                    uStack_654 = local_660;
                    local_650 = fVar152;
                    fStack_64c = fVar152;
                    fStack_648 = fVar152;
                    fStack_644 = fVar152;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar2->occlusionFilterN)(&local_9f0);
                      auVar239 = ZEXT1664(ZEXT416((uint)fVar152));
                      auVar266 = ZEXT3264(local_b00);
                      auVar278 = ZEXT3264(local_a40);
                      auVar271 = ZEXT3264(local_a20);
                    }
                    auVar242 = local_9a0._0_28_;
                    auVar61._8_8_ = uStack_b58;
                    auVar61._0_8_ = local_b60;
                    if (auVar61 == (undefined1  [16])0x0) {
                      auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar96 = auVar96 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var3)(&local_9f0);
                        auVar239 = ZEXT1664(ZEXT416((uint)fVar152));
                        auVar266 = ZEXT3264(local_b00);
                        auVar278 = ZEXT3264(local_a40);
                        auVar271 = ZEXT3264(local_a20);
                        auVar242 = local_9a0._0_28_;
                      }
                      auVar62._8_8_ = uStack_b58;
                      auVar62._0_8_ = local_b60;
                      auVar202 = vpcmpeqd_avx((undefined1  [16])0x0,auVar62);
                      auVar96 = auVar202 ^ _DAT_01febe20;
                      auVar161._8_4_ = 0xff800000;
                      auVar161._0_8_ = 0xff800000ff800000;
                      auVar161._12_4_ = 0xff800000;
                      auVar202 = vblendvps_avx(auVar161,*(undefined1 (*) [16])(local_9f0.ray + 0x80)
                                               ,auVar202);
                      *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar202;
                    }
                    auVar132._8_8_ = 0x100000001;
                    auVar132._0_8_ = 0x100000001;
                    unaff_BL = (auVar132 & auVar96) != (undefined1  [16])0x0;
                    if (!(bool)unaff_BL) {
                      *(float *)(ray + k * 4 + 0x80) = fVar85;
                    }
                    bVar52 = false;
                  }
                }
                if (!bVar52) goto LAB_016e787d;
                lVar79 = lVar79 + -1;
              } while (lVar79 != 0);
              unaff_BL = 0;
LAB_016e787d:
              unaff_BL = unaff_BL & 1;
              uVar83 = CONCAT71(local_760._1_7_,local_760[0] | unaff_BL);
              uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar112._4_4_ = uVar81;
              auVar112._0_4_ = uVar81;
              auVar112._8_4_ = uVar81;
              auVar112._12_4_ = uVar81;
              auVar112._16_4_ = uVar81;
              auVar112._20_4_ = uVar81;
              auVar112._24_4_ = uVar81;
              auVar112._28_4_ = uVar81;
              auVar8 = vcmpps_avx(_local_780,auVar112,2);
              auVar111 = vandps_avx(auVar8,local_580);
              auVar239 = ZEXT3264(auVar111);
              auVar8 = local_580 & auVar8;
              uVar82 = local_5e0;
              local_580 = auVar111;
            } while ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar8 >> 0x7f,0) != '\0') ||
                       (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar8 >> 0xbf,0) != '\0') ||
                     (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar8[0x1f] < '\0');
          }
          auVar117._0_4_ = auVar242._0_4_ * (float)local_800._0_4_;
          auVar117._4_4_ = auVar242._4_4_ * (float)local_800._4_4_;
          auVar117._8_4_ = auVar242._8_4_ * fStack_7f8;
          auVar117._12_4_ = auVar242._12_4_ * fStack_7f4;
          auVar117._16_4_ = auVar242._16_4_ * fStack_7f0;
          auVar117._20_4_ = auVar242._20_4_ * fStack_7ec;
          auVar117._28_36_ = auVar239._28_36_;
          auVar117._24_4_ = auVar242._24_4_ * fStack_7e8;
          auVar96 = vfmadd213ps_fma(local_7e0,_local_8e0,auVar117._0_32_);
          auVar96 = vfmadd213ps_fma(_local_7c0,_local_b40,ZEXT1632(auVar96));
          auVar69._4_4_ = uStack_79c;
          auVar69._0_4_ = local_7a0;
          auVar69._8_4_ = uStack_798;
          auVar69._12_4_ = uStack_794;
          auVar69._16_4_ = uStack_790;
          auVar69._20_4_ = uStack_78c;
          auVar69._24_4_ = uStack_788;
          auVar69._28_4_ = uStack_784;
          auVar111 = vandps_avx(ZEXT1632(auVar96),auVar69);
          auVar146._8_4_ = 0x3e99999a;
          auVar146._0_8_ = 0x3e99999a3e99999a;
          auVar146._12_4_ = 0x3e99999a;
          auVar146._16_4_ = 0x3e99999a;
          auVar146._20_4_ = 0x3e99999a;
          auVar146._24_4_ = 0x3e99999a;
          auVar146._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar146,1);
          auVar8 = vorps_avx(auVar111,local_520);
          auVar147._0_4_ = (float)local_8c0._0_4_ + (float)local_4e0._0_4_;
          auVar147._4_4_ = (float)local_8c0._4_4_ + (float)local_4e0._4_4_;
          auVar147._8_4_ = fStack_8b8 + fStack_4d8;
          auVar147._12_4_ = fStack_8b4 + fStack_4d4;
          auVar147._16_4_ = fStack_8b0 + fStack_4d0;
          auVar147._20_4_ = fStack_8ac + fStack_4cc;
          auVar147._24_4_ = fStack_8a8 + fStack_4c8;
          auVar147._28_4_ = fStack_8a4 + fStack_4c4;
          uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar169._4_4_ = uVar81;
          auVar169._0_4_ = uVar81;
          auVar169._8_4_ = uVar81;
          auVar169._12_4_ = uVar81;
          auVar169._16_4_ = uVar81;
          auVar169._20_4_ = uVar81;
          auVar169._24_4_ = uVar81;
          auVar169._28_4_ = uVar81;
          auVar111 = vcmpps_avx(auVar147,auVar169,2);
          local_7e0 = vandps_avx(auVar111,local_500);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar170,auVar148,auVar8);
          _local_800 = vpcmpgtd_avx2(auVar111,local_540);
          auVar111 = vpandn_avx2(_local_800,local_7e0);
          auVar8 = local_7e0 & ~_local_800;
          if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar8 >> 0x7f,0) == '\0') &&
                (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar8 >> 0xbf,0) == '\0') &&
              (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar8[0x1f]) {
            auVar259 = ZEXT3264(local_900);
            auVar239 = ZEXT3264(local_a80);
            local_5e0 = uVar82;
          }
          else {
            auVar202 = vminps_avx(local_ab0,local_ad0);
            auVar96 = vmaxps_avx(local_ab0,local_ad0);
            auVar256 = vminps_avx(local_ac0,_local_ae0);
            auVar4 = vminps_avx(auVar202,auVar256);
            auVar202 = vmaxps_avx(local_ac0,_local_ae0);
            auVar256 = vmaxps_avx(auVar96,auVar202);
            auVar96 = vandps_avx(auVar4,local_920);
            auVar202 = vandps_avx(auVar256,local_920);
            auVar96 = vmaxps_avx(auVar96,auVar202);
            auVar202 = vmovshdup_avx(auVar96);
            auVar202 = vmaxss_avx(auVar202,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar202);
            local_860._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_740 = vshufps_avx(auVar256,auVar256,0xff);
            _local_780 = _local_360;
            local_7c0._4_4_ = (float)local_8c0._4_4_ + (float)local_360._4_4_;
            local_7c0._0_4_ = (float)local_8c0._0_4_ + (float)local_360._0_4_;
            fStack_7b8 = fStack_8b8 + fStack_358;
            fStack_7b4 = fStack_8b4 + fStack_354;
            fStack_7b0 = fStack_8b0 + fStack_350;
            fStack_7ac = fStack_8ac + fStack_34c;
            fStack_7a8 = fStack_8a8 + fStack_348;
            fStack_7a4 = fStack_8a4 + fStack_344;
            do {
              auVar149._8_4_ = 0x7f800000;
              auVar149._0_8_ = 0x7f8000007f800000;
              auVar149._12_4_ = 0x7f800000;
              auVar149._16_4_ = 0x7f800000;
              auVar149._20_4_ = 0x7f800000;
              auVar149._24_4_ = 0x7f800000;
              auVar149._28_4_ = 0x7f800000;
              auVar8 = vblendvps_avx(auVar149,_local_780,auVar111);
              auVar103 = vshufps_avx(auVar8,auVar8,0xb1);
              auVar103 = vminps_avx(auVar8,auVar103);
              auVar277 = vshufpd_avx(auVar103,auVar103,5);
              auVar103 = vminps_avx(auVar103,auVar277);
              auVar277 = vpermpd_avx2(auVar103,0x4e);
              auVar103 = vminps_avx(auVar103,auVar277);
              auVar103 = vcmpps_avx(auVar8,auVar103,0);
              auVar277 = auVar111 & auVar103;
              auVar8 = auVar111;
              if ((((((((auVar277 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar277 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar277 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar277 >> 0x7f,0) != '\0') ||
                    (auVar277 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar277 >> 0xbf,0) != '\0') ||
                  (auVar277 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar277[0x1f] < '\0') {
                auVar8 = vandps_avx(auVar103,auVar111);
              }
              local_760._0_8_ = uVar83;
              uVar76 = vmovmskps_avx(auVar8);
              iVar14 = 0;
              for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar77 = iVar14 << 2;
              local_5a0 = auVar111;
              *(undefined4 *)(local_5a0 + uVar77) = 0;
              uVar76 = *(uint *)(local_480 + uVar77);
              fVar119 = *(float *)(local_340 + uVar77);
              fVar85 = local_b48;
              if ((float)local_930._0_4_ < 0.0) {
                fVar85 = sqrtf((float)local_930._0_4_);
              }
              auVar283 = ZEXT464(uVar76);
              local_8a0._0_4_ = fVar85 * 1.9073486e-06;
              lVar79 = 5;
              do {
                fVar152 = auVar283._0_4_;
                fVar85 = 1.0 - fVar152;
                auVar133._0_4_ = local_ad0._0_4_ * fVar152;
                auVar133._4_4_ = local_ad0._4_4_ * fVar152;
                auVar133._8_4_ = local_ad0._8_4_ * fVar152;
                auVar133._12_4_ = local_ad0._12_4_ * fVar152;
                auVar162._4_4_ = fVar85;
                auVar162._0_4_ = fVar85;
                auVar162._8_4_ = fVar85;
                auVar162._12_4_ = fVar85;
                auVar96 = vfmadd231ps_fma(auVar133,auVar162,local_ab0);
                auVar183._0_4_ = local_ac0._0_4_ * fVar152;
                auVar183._4_4_ = local_ac0._4_4_ * fVar152;
                auVar183._8_4_ = local_ac0._8_4_ * fVar152;
                auVar183._12_4_ = local_ac0._12_4_ * fVar152;
                auVar202 = vfmadd231ps_fma(auVar183,auVar162,local_ad0);
                auVar224._0_4_ = fVar152 * auVar202._0_4_;
                auVar224._4_4_ = fVar152 * auVar202._4_4_;
                auVar224._8_4_ = fVar152 * auVar202._8_4_;
                auVar224._12_4_ = fVar152 * auVar202._12_4_;
                local_a60._0_16_ = vfmadd231ps_fma(auVar224,auVar162,auVar96);
                auVar134._0_4_ = fVar152 * (float)local_ae0._0_4_;
                auVar134._4_4_ = fVar152 * (float)local_ae0._4_4_;
                auVar134._8_4_ = fVar152 * fStack_ad8;
                auVar134._12_4_ = fVar152 * fStack_ad4;
                auVar96 = vfmadd231ps_fma(auVar134,auVar162,local_ac0);
                auVar204._0_4_ = fVar152 * auVar96._0_4_;
                auVar204._4_4_ = fVar152 * auVar96._4_4_;
                auVar204._8_4_ = fVar152 * auVar96._8_4_;
                auVar204._12_4_ = fVar152 * auVar96._12_4_;
                auVar202 = vfmadd231ps_fma(auVar204,auVar162,auVar202);
                auVar135._4_4_ = fVar119;
                auVar135._0_4_ = fVar119;
                auVar135._8_4_ = fVar119;
                auVar135._12_4_ = fVar119;
                auVar96 = vfmadd213ps_fma(auVar135,local_910,_DAT_01feba10);
                auVar95._0_4_ = fVar152 * auVar202._0_4_;
                auVar95._4_4_ = fVar152 * auVar202._4_4_;
                auVar95._8_4_ = fVar152 * auVar202._8_4_;
                auVar95._12_4_ = fVar152 * auVar202._12_4_;
                auVar256 = vfmadd231ps_fma(auVar95,local_a60._0_16_,auVar162);
                local_6c0._0_16_ = auVar256;
                auVar96 = vsubps_avx(auVar96,auVar256);
                _local_880 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_9c0._0_16_ = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  local_b20._0_16_ = auVar202;
                  auVar118._0_4_ = sqrtf(auVar96._0_4_);
                  auVar118._4_60_ = extraout_var_00;
                  auVar96 = auVar118._0_16_;
                  auVar202 = local_b20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                }
                auVar202 = vsubps_avx(auVar202,local_a60._0_16_);
                local_a60._0_4_ = auVar202._0_4_ * 3.0;
                local_a60._4_4_ = auVar202._4_4_ * 3.0;
                local_a60._8_4_ = auVar202._8_4_ * 3.0;
                local_a60._12_4_ = auVar202._12_4_ * 3.0;
                auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar85),
                                           auVar283._0_16_);
                auVar256 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar283._0_16_,
                                           ZEXT416((uint)fVar85));
                fVar85 = fVar85 * 6.0;
                fVar86 = auVar202._0_4_ * 6.0;
                fVar157 = auVar256._0_4_ * 6.0;
                fVar153 = fVar152 * 6.0;
                auVar184._0_4_ = fVar153 * (float)local_ae0._0_4_;
                auVar184._4_4_ = fVar153 * (float)local_ae0._4_4_;
                auVar184._8_4_ = fVar153 * fStack_ad8;
                auVar184._12_4_ = fVar153 * fStack_ad4;
                auVar136._4_4_ = fVar157;
                auVar136._0_4_ = fVar157;
                auVar136._8_4_ = fVar157;
                auVar136._12_4_ = fVar157;
                auVar202 = vfmadd132ps_fma(auVar136,auVar184,local_ac0);
                auVar185._4_4_ = fVar86;
                auVar185._0_4_ = fVar86;
                auVar185._8_4_ = fVar86;
                auVar185._12_4_ = fVar86;
                auVar202 = vfmadd132ps_fma(auVar185,auVar202,local_ad0);
                auVar256 = vdpps_avx(local_a60._0_16_,local_a60._0_16_,0x7f);
                auVar137._4_4_ = fVar85;
                auVar137._0_4_ = fVar85;
                auVar137._8_4_ = fVar85;
                auVar137._12_4_ = fVar85;
                auVar129 = vfmadd132ps_fma(auVar137,auVar202,local_ab0);
                auVar202 = vblendps_avx(auVar256,_DAT_01feba10,0xe);
                auVar4 = vrsqrtss_avx(auVar202,auVar202);
                fVar157 = auVar256._0_4_;
                fVar85 = auVar4._0_4_;
                auVar4 = vdpps_avx(local_a60._0_16_,auVar129,0x7f);
                fVar85 = fVar85 * 1.5 + fVar157 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar138._0_4_ = auVar129._0_4_ * fVar157;
                auVar138._4_4_ = auVar129._4_4_ * fVar157;
                auVar138._8_4_ = auVar129._8_4_ * fVar157;
                auVar138._12_4_ = auVar129._12_4_ * fVar157;
                fVar86 = auVar4._0_4_;
                auVar225._0_4_ = local_a60._0_4_ * fVar86;
                auVar225._4_4_ = local_a60._4_4_ * fVar86;
                auVar225._8_4_ = local_a60._8_4_ * fVar86;
                auVar225._12_4_ = local_a60._12_4_ * fVar86;
                auVar4 = vsubps_avx(auVar138,auVar225);
                auVar202 = vrcpss_avx(auVar202,auVar202);
                auVar129 = vfnmadd213ss_fma(auVar202,auVar256,ZEXT416(0x40000000));
                fVar86 = auVar202._0_4_ * auVar129._0_4_;
                auVar202 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                      ZEXT416((uint)(fVar119 * (float)local_8a0._0_4_)));
                uVar83 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
                auVar264._0_8_ = uVar83 ^ 0x8000000080000000;
                auVar264._8_4_ = -local_a60._8_4_;
                auVar264._12_4_ = -local_a60._12_4_;
                auVar186._0_4_ = fVar85 * auVar4._0_4_ * fVar86;
                auVar186._4_4_ = fVar85 * auVar4._4_4_ * fVar86;
                auVar186._8_4_ = fVar85 * auVar4._8_4_ * fVar86;
                auVar186._12_4_ = fVar85 * auVar4._12_4_ * fVar86;
                local_980._0_4_ = local_a60._0_4_ * fVar85;
                local_980._4_4_ = local_a60._4_4_ * fVar85;
                local_980._8_4_ = local_a60._8_4_ * fVar85;
                local_980._12_4_ = local_a60._12_4_ * fVar85;
                if (fVar157 < -fVar157) {
                  local_b20._0_4_ = auVar96._0_4_;
                  local_960._0_16_ = auVar264;
                  local_aa0._0_16_ = auVar186;
                  fVar85 = sqrtf(fVar157);
                  auVar96 = ZEXT416((uint)local_b20._0_4_);
                  auVar186 = local_aa0._0_16_;
                  auVar264 = local_960._0_16_;
                }
                else {
                  auVar256 = vsqrtss_avx(auVar256,auVar256);
                  fVar85 = auVar256._0_4_;
                }
                local_b20._0_16_ = vdpps_avx(_local_880,local_980._0_16_,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar96,
                                         ZEXT416((uint)auVar202._0_4_));
                auVar256 = vdpps_avx(auVar264,local_980._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_880,auVar186,0x7f);
                auVar129 = vdpps_avx(local_910,local_980._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_860._0_4_ / fVar85)),auVar5);
                local_960._0_4_ = auVar96._0_4_;
                fVar85 = auVar256._0_4_ + auVar4._0_4_;
                auVar97._0_4_ = local_b20._0_4_ * local_b20._0_4_;
                auVar97._4_4_ = local_b20._4_4_ * local_b20._4_4_;
                auVar97._8_4_ = local_b20._8_4_ * local_b20._8_4_;
                auVar97._12_4_ = local_b20._12_4_ * local_b20._12_4_;
                auVar96 = vdpps_avx(_local_880,auVar264,0x7f);
                auVar4 = vsubps_avx(local_9c0._0_16_,auVar97);
                auVar256 = vrsqrtss_avx(auVar4,auVar4);
                fVar157 = auVar4._0_4_;
                fVar86 = auVar256._0_4_;
                fVar86 = fVar86 * 1.5 + fVar157 * -0.5 * fVar86 * fVar86 * fVar86;
                auVar256 = vdpps_avx(_local_880,local_910,0x7f);
                local_980._0_16_ = vfnmadd231ss_fma(auVar96,local_b20._0_16_,ZEXT416((uint)fVar85));
                auVar96 = vfnmadd231ss_fma(auVar256,local_b20._0_16_,auVar129);
                if (fVar157 < 0.0) {
                  local_aa0._0_16_ = ZEXT416((uint)fVar85);
                  local_6e0._0_16_ = auVar129;
                  local_700._0_4_ = fVar86;
                  local_720._0_16_ = auVar96;
                  fVar157 = sqrtf(fVar157);
                  fVar86 = (float)local_700._0_4_;
                  auVar96 = local_720._0_16_;
                  auVar129 = local_6e0._0_16_;
                  auVar256 = local_aa0._0_16_;
                }
                else {
                  auVar256 = vsqrtss_avx(auVar4,auVar4);
                  fVar157 = auVar256._0_4_;
                  auVar256 = ZEXT416((uint)fVar85);
                }
                auVar271 = ZEXT3264(local_a20);
                auVar278 = ZEXT3264(local_a40);
                auVar266 = ZEXT3264(local_b00);
                auVar239 = ZEXT3264(local_a80);
                auVar4 = vpermilps_avx(local_6c0._0_16_,0xff);
                auVar5 = vpermilps_avx(local_a60._0_16_,0xff);
                auVar91 = vfmsub213ss_fma(local_980._0_16_,ZEXT416((uint)fVar86),auVar5);
                auVar187._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = auVar129._8_4_ ^ 0x80000000;
                auVar187._12_4_ = auVar129._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * fVar86));
                auVar129 = vfmsub231ss_fma(ZEXT416((uint)(auVar129._0_4_ * auVar91._0_4_)),auVar256,
                                           auVar96);
                auVar96 = vinsertps_avx(auVar96,auVar187,0x10);
                uVar81 = auVar129._0_4_;
                auVar188._4_4_ = uVar81;
                auVar188._0_4_ = uVar81;
                auVar188._8_4_ = uVar81;
                auVar188._12_4_ = uVar81;
                auVar96 = vdivps_avx(auVar96,auVar188);
                auVar129 = ZEXT416((uint)(fVar157 - auVar4._0_4_));
                auVar4 = vinsertps_avx(local_b20._0_16_,auVar129,0x10);
                auVar163._0_4_ = auVar4._0_4_ * auVar96._0_4_;
                auVar163._4_4_ = auVar4._4_4_ * auVar96._4_4_;
                auVar163._8_4_ = auVar4._8_4_ * auVar96._8_4_;
                auVar163._12_4_ = auVar4._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar205,auVar256,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar188);
                auVar256 = vhaddps_avx(auVar163,auVar163);
                auVar189._0_4_ = auVar4._0_4_ * auVar96._0_4_;
                auVar189._4_4_ = auVar4._4_4_ * auVar96._4_4_;
                auVar189._8_4_ = auVar4._8_4_ * auVar96._8_4_;
                auVar189._12_4_ = auVar4._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar189,auVar189);
                fVar152 = fVar152 - auVar256._0_4_;
                auVar283 = ZEXT464((uint)fVar152);
                fVar119 = fVar119 - auVar96._0_4_;
                auVar96 = vandps_avx(local_b20._0_16_,local_920);
                bVar52 = true;
                if ((float)local_960._0_4_ <= auVar96._0_4_) {
                  auVar259 = ZEXT3264(local_900);
                }
                else {
                  auVar202 = vfmadd231ss_fma(ZEXT416((uint)((float)local_960._0_4_ + auVar202._0_4_)
                                                    ),local_740,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar129,local_920);
                  auVar259 = ZEXT3264(local_900);
                  if (auVar96._0_4_ < auVar202._0_4_) {
                    fVar119 = fVar119 + (float)local_830._0_4_;
                    if ((((fVar84 <= fVar119) &&
                         (fVar85 = *(float *)(ray + k * 4 + 0x80), fVar119 <= fVar85)) &&
                        (0.0 <= fVar152)) && (fVar152 <= 1.0)) {
                      auVar96 = vrsqrtss_avx(local_9c0._0_16_,local_9c0._0_16_);
                      fVar86 = auVar96._0_4_;
                      pGVar2 = (context->scene->geometries).items[local_b50].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar86 = fVar86 * 1.5 + local_9c0._0_4_ * -0.5 * fVar86 * fVar86 * fVar86;
                          auVar139._0_4_ = fVar86 * (float)local_880._0_4_;
                          auVar139._4_4_ = fVar86 * (float)local_880._4_4_;
                          auVar139._8_4_ = fVar86 * fStack_878;
                          auVar139._12_4_ = fVar86 * fStack_874;
                          auVar4 = vfmadd213ps_fma(auVar5,auVar139,local_a60._0_16_);
                          auVar96 = vshufps_avx(auVar139,auVar139,0xc9);
                          auVar202 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                          auVar140._0_4_ = auVar139._0_4_ * auVar202._0_4_;
                          auVar140._4_4_ = auVar139._4_4_ * auVar202._4_4_;
                          auVar140._8_4_ = auVar139._8_4_ * auVar202._8_4_;
                          auVar140._12_4_ = auVar139._12_4_ * auVar202._12_4_;
                          auVar256 = vfmsub231ps_fma(auVar140,local_a60._0_16_,auVar96);
                          auVar96 = vshufps_avx(auVar256,auVar256,0xc9);
                          auVar202 = vshufps_avx(auVar4,auVar4,0xc9);
                          auVar256 = vshufps_avx(auVar256,auVar256,0xd2);
                          auVar98._0_4_ = auVar4._0_4_ * auVar256._0_4_;
                          auVar98._4_4_ = auVar4._4_4_ * auVar256._4_4_;
                          auVar98._8_4_ = auVar4._8_4_ * auVar256._8_4_;
                          auVar98._12_4_ = auVar4._12_4_ * auVar256._12_4_;
                          auVar96 = vfmsub231ps_fma(auVar98,auVar96,auVar202);
                          local_680 = (RTCHitN  [16])vshufps_avx(auVar96,auVar96,0x55);
                          auStack_670 = vshufps_avx(auVar96,auVar96,0xaa);
                          local_660 = auVar96._0_4_;
                          local_640 = ZEXT416(0) << 0x20;
                          local_630 = CONCAT44(uStack_69c,local_6a0);
                          uStack_628 = CONCAT44(uStack_694,uStack_698);
                          local_620._4_4_ = uStack_68c;
                          local_620._0_4_ = local_690;
                          local_620._8_4_ = uStack_688;
                          local_620._12_4_ = uStack_684;
                          vpcmpeqd_avx2(ZEXT1632(local_620),ZEXT1632(local_620));
                          uStack_60c = context->user->instID[0];
                          local_610 = uStack_60c;
                          uStack_608 = uStack_60c;
                          uStack_604 = uStack_60c;
                          uStack_600 = context->user->instPrimID[0];
                          uStack_5fc = uStack_600;
                          uStack_5f8 = uStack_600;
                          uStack_5f4 = uStack_600;
                          *(float *)(ray + k * 4 + 0x80) = fVar119;
                          local_b60 = *local_9f8;
                          uStack_b58 = local_9f8[1];
                          local_9f0.valid = (int *)&local_b60;
                          local_9f0.geometryUserPtr = pGVar2->userPtr;
                          local_9f0.context = context->user;
                          local_9f0.hit = local_680;
                          local_9f0.N = 4;
                          local_9f0.ray = (RTCRayN *)ray;
                          uStack_65c = local_660;
                          uStack_658 = local_660;
                          uStack_654 = local_660;
                          local_650 = fVar152;
                          fStack_64c = fVar152;
                          fStack_648 = fVar152;
                          fStack_644 = fVar152;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar2->occlusionFilterN)(&local_9f0);
                            auVar283 = ZEXT1664(ZEXT416((uint)fVar152));
                            auVar239 = ZEXT3264(local_a80);
                            auVar266 = ZEXT3264(local_b00);
                            auVar278 = ZEXT3264(local_a40);
                            auVar271 = ZEXT3264(local_a20);
                            auVar259 = ZEXT3264(local_900);
                          }
                          auVar63._8_8_ = uStack_b58;
                          auVar63._0_8_ = local_b60;
                          if (auVar63 == (undefined1  [16])0x0) {
                            auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar96 = auVar96 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var3 = context->args->filter;
                            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var3)(&local_9f0);
                              auVar283 = ZEXT1664(ZEXT416((uint)fVar152));
                              auVar239 = ZEXT3264(local_a80);
                              auVar266 = ZEXT3264(local_b00);
                              auVar278 = ZEXT3264(local_a40);
                              auVar271 = ZEXT3264(local_a20);
                              auVar259 = ZEXT3264(local_900);
                            }
                            auVar64._8_8_ = uStack_b58;
                            auVar64._0_8_ = local_b60;
                            auVar202 = vpcmpeqd_avx((undefined1  [16])0x0,auVar64);
                            auVar96 = auVar202 ^ _DAT_01febe20;
                            auVar164._8_4_ = 0xff800000;
                            auVar164._0_8_ = 0xff800000ff800000;
                            auVar164._12_4_ = 0xff800000;
                            auVar202 = vblendvps_avx(auVar164,*(undefined1 (*) [16])
                                                               (local_9f0.ray + 0x80),auVar202);
                            *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar202;
                          }
                          auVar141._8_8_ = 0x100000001;
                          auVar141._0_8_ = 0x100000001;
                          unaff_BL = (auVar141 & auVar96) != (undefined1  [16])0x0;
                          if (!(bool)unaff_BL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar85;
                          }
                        }
                        bVar52 = false;
                        goto LAB_016e7fe9;
                      }
                    }
                    bVar52 = false;
                    unaff_BL = 0;
                  }
                }
LAB_016e7fe9:
                if (!bVar52) goto LAB_016e8343;
                lVar79 = lVar79 + -1;
              } while (lVar79 != 0);
              unaff_BL = 0;
LAB_016e8343:
              unaff_BL = unaff_BL & 1;
              uVar83 = CONCAT71(local_760._1_7_,local_760[0] | unaff_BL);
              uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar113._4_4_ = uVar81;
              auVar113._0_4_ = uVar81;
              auVar113._8_4_ = uVar81;
              auVar113._12_4_ = uVar81;
              auVar113._16_4_ = uVar81;
              auVar113._20_4_ = uVar81;
              auVar113._24_4_ = uVar81;
              auVar113._28_4_ = uVar81;
              auVar8 = vcmpps_avx(_local_7c0,auVar113,2);
              auVar111 = vandps_avx(auVar8,local_5a0);
              local_5a0 = local_5a0 & auVar8;
            } while ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_5a0 >> 0x7f,0) != '\0') ||
                       (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_5a0 >> 0xbf,0) != '\0') ||
                     (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_5a0[0x1f] < '\0');
          }
          auVar150._0_4_ = (float)local_8c0._0_4_ + local_3a0._0_4_;
          auVar150._4_4_ = (float)local_8c0._4_4_ + local_3a0._4_4_;
          auVar150._8_4_ = fStack_8b8 + local_3a0._8_4_;
          auVar150._12_4_ = fStack_8b4 + local_3a0._12_4_;
          auVar150._16_4_ = fStack_8b0 + local_3a0._16_4_;
          auVar150._20_4_ = fStack_8ac + local_3a0._20_4_;
          auVar150._24_4_ = fStack_8a8 + local_3a0._24_4_;
          auVar150._28_4_ = fStack_8a4 + local_3a0._28_4_;
          uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar196._4_4_ = uVar81;
          auVar196._0_4_ = uVar81;
          auVar196._8_4_ = uVar81;
          auVar196._12_4_ = uVar81;
          auVar196._16_4_ = uVar81;
          auVar196._20_4_ = uVar81;
          auVar196._24_4_ = uVar81;
          auVar196._28_4_ = uVar81;
          auVar8 = vcmpps_avx(auVar150,auVar196,2);
          auVar111 = vandps_avx(local_4c0,local_4a0);
          auVar111 = vandps_avx(auVar8,auVar111);
          auVar210._0_4_ = (float)local_8c0._0_4_ + local_360._0_4_;
          auVar210._4_4_ = (float)local_8c0._4_4_ + local_360._4_4_;
          auVar210._8_4_ = fStack_8b8 + local_360._8_4_;
          auVar210._12_4_ = fStack_8b4 + local_360._12_4_;
          auVar210._16_4_ = fStack_8b0 + local_360._16_4_;
          auVar210._20_4_ = fStack_8ac + local_360._20_4_;
          auVar210._24_4_ = fStack_8a8 + local_360._24_4_;
          auVar210._28_4_ = fStack_8a4 + local_360._28_4_;
          auVar103 = vcmpps_avx(auVar210,auVar196,2);
          auVar8 = vandps_avx(_local_800,local_7e0);
          auVar8 = vandps_avx(auVar103,auVar8);
          auVar8 = vorps_avx(auVar111,auVar8);
          if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0x7f,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0xbf,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar8[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar8;
            auVar111 = vblendvps_avx(_local_360,local_3a0,auVar111);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar111;
            uVar87 = vmovlps_avx(local_820);
            *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar87;
            auStack_138[uVar78 * 0x18] = (int)local_5e0 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
        }
      }
    }
    do {
      uVar75 = uStack_5a8;
      uVar74 = uStack_5b0;
      uVar73 = uStack_5b8;
      uVar87 = local_5c0;
      uVar76 = (uint)uVar78;
      if (uVar76 == 0) {
        if ((uVar83 & 1) != 0) {
          return local_be9;
        }
        uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar99._4_4_ = uVar81;
        auVar99._0_4_ = uVar81;
        auVar99._8_4_ = uVar81;
        auVar99._12_4_ = uVar81;
        auVar96 = vcmpps_avx(local_430,auVar99,2);
        uVar76 = vmovmskps_avx(auVar96);
        uVar76 = (uint)local_808 & uVar76;
        local_be9 = uVar76 != 0;
        if (!local_be9) {
          return local_be9;
        }
        goto LAB_016e5e4d;
      }
      uVar78 = (ulong)(uVar76 - 1);
      lVar79 = uVar78 * 0x60;
      auVar111 = *(undefined1 (*) [32])(auStack_160 + lVar79);
      auVar114._0_4_ = (float)local_8c0._0_4_ + auVar111._0_4_;
      auVar114._4_4_ = (float)local_8c0._4_4_ + auVar111._4_4_;
      auVar114._8_4_ = fStack_8b8 + auVar111._8_4_;
      auVar114._12_4_ = fStack_8b4 + auVar111._12_4_;
      auVar114._16_4_ = fStack_8b0 + auVar111._16_4_;
      auVar114._20_4_ = fStack_8ac + auVar111._20_4_;
      auVar114._24_4_ = fStack_8a8 + auVar111._24_4_;
      auVar114._28_4_ = fStack_8a4 + auVar111._28_4_;
      uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar197._4_4_ = uVar81;
      auVar197._0_4_ = uVar81;
      auVar197._8_4_ = uVar81;
      auVar197._12_4_ = uVar81;
      auVar197._16_4_ = uVar81;
      auVar197._20_4_ = uVar81;
      auVar197._24_4_ = uVar81;
      auVar197._28_4_ = uVar81;
      auVar8 = vcmpps_avx(auVar114,auVar197,2);
      _local_680 = vandps_avx(auVar8,*(undefined1 (*) [32])(auStack_180 + lVar79));
      auVar8 = *(undefined1 (*) [32])(auStack_180 + lVar79) & auVar8;
      bVar59 = (auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar58 = (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = SUB321(auVar8 >> 0x7f,0) == '\0';
      bVar56 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = SUB321(auVar8 >> 0xbf,0) == '\0';
      bVar54 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = -1 < auVar8[0x1f];
      if (((((((!bVar59 || !bVar60) || !bVar58) || !bVar57) || !bVar56) || !bVar55) || !bVar54) ||
          !bVar52) {
        auVar171._8_4_ = 0x7f800000;
        auVar171._0_8_ = 0x7f8000007f800000;
        auVar171._12_4_ = 0x7f800000;
        auVar171._16_4_ = 0x7f800000;
        auVar171._20_4_ = 0x7f800000;
        auVar171._24_4_ = 0x7f800000;
        auVar171._28_4_ = 0x7f800000;
        auVar111 = vblendvps_avx(auVar171,auVar111,_local_680);
        auVar8 = vshufps_avx(auVar111,auVar111,0xb1);
        auVar8 = vminps_avx(auVar111,auVar8);
        auVar103 = vshufpd_avx(auVar8,auVar8,5);
        auVar8 = vminps_avx(auVar8,auVar103);
        auVar103 = vpermpd_avx2(auVar8,0x4e);
        auVar8 = vminps_avx(auVar8,auVar103);
        auVar8 = vcmpps_avx(auVar111,auVar8,0);
        auVar103 = _local_680 & auVar8;
        auVar111 = _local_680;
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0x7f,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar103 >> 0xbf,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar103[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar8,_local_680);
        }
        fVar119 = afStack_140[uVar78 * 0x18 + 1];
        uVar77 = auStack_138[uVar78 * 0x18];
        uVar80 = vmovmskps_avx(auVar111);
        iVar14 = 0;
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        fVar85 = afStack_140[uVar78 * 0x18];
        auVar115._4_4_ = fVar85;
        auVar115._0_4_ = fVar85;
        auVar115._8_4_ = fVar85;
        auVar115._12_4_ = fVar85;
        auVar115._16_4_ = fVar85;
        auVar115._20_4_ = fVar85;
        auVar115._24_4_ = fVar85;
        auVar115._28_4_ = fVar85;
        *(undefined4 *)(local_680 + (uint)(iVar14 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar79) = _local_680;
        uVar80 = uVar76 - 1;
        if ((((((((_local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_680 >> 0x7f,0) != '\0') ||
              (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_680 >> 0xbf,0) != '\0') ||
            (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_680[0x1f] < '\0') {
          uVar80 = uVar76;
        }
        fVar119 = fVar119 - fVar85;
        auVar151._4_4_ = fVar119;
        auVar151._0_4_ = fVar119;
        auVar151._8_4_ = fVar119;
        auVar151._12_4_ = fVar119;
        auVar151._16_4_ = fVar119;
        auVar151._20_4_ = fVar119;
        auVar151._24_4_ = fVar119;
        auVar151._28_4_ = fVar119;
        auVar96 = vfmadd132ps_fma(auVar151,auVar115,_DAT_02020f20);
        local_3a0 = ZEXT1632(auVar96);
        local_820._8_8_ = 0;
        local_820._0_8_ = *(ulong *)(local_3a0 + (uint)(iVar14 << 2));
        uVar78 = (ulong)uVar80;
        local_5e0 = (ulong)uVar77;
      }
      auVar8._8_8_ = uVar73;
      auVar8._0_8_ = uVar87;
      auVar8._16_8_ = uVar74;
      auVar8._24_8_ = uVar75;
    } while (((((((bVar59 && bVar60) && bVar58) && bVar57) && bVar56) && bVar55) && bVar54) &&
             bVar52);
    auVar103._8_8_ = uStack_3f8;
    auVar103._0_8_ = local_400;
    auVar103._16_8_ = uStack_3f0;
    auVar103._24_8_ = uStack_3e8;
    auVar269 = auVar271._0_32_;
    auVar277 = auVar278._0_32_;
    auVar165 = auVar266._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }